

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O1

vbool<4> __thiscall
embree::sse42::InstanceArrayIntersectorKMB<4>::occluded
          (InstanceArrayIntersectorKMB<4> *this,vbool<4> *valid_i,Precalculations *pre,RayK<4> *ray,
          RayQueryContext *context,Primitive_conflict4 *prim)

{
  RayK<4> *pRVar1;
  undefined8 uVar2;
  RTCRayQueryContext *pRVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [12];
  _func_int *p_Var7;
  Geometry *extraout_RDX;
  Geometry *pGVar8;
  uint uVar9;
  long *plVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar39;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ulong uVar41;
  undefined1 auVar26 [16];
  uint uVar38;
  uint uVar42;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint uVar43;
  undefined1 auVar35 [16];
  uint uVar40;
  uint uVar44;
  undefined1 auVar36 [16];
  undefined1 auVar46 [12];
  undefined4 uVar45;
  undefined4 uVar75;
  vfloat4 v_8;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar77;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined4 uVar76;
  undefined4 uVar78;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  vfloat4 v_5;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar100;
  float fVar112;
  float fVar114;
  vfloat4 v_7;
  float fVar101;
  float fVar113;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar120 [12];
  float fVar118;
  float fVar119;
  float fVar133;
  vfloat4 v_9;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar138;
  float fVar139;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar141;
  float fVar180;
  float fVar181;
  undefined1 in_XMM5 [16];
  float fVar182;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar183;
  float fVar184;
  float fVar191;
  float fVar193;
  undefined1 in_XMM6 [16];
  undefined1 auVar185 [16];
  float fVar192;
  float fVar194;
  float fVar195;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar196;
  float fVar209;
  float fVar210;
  undefined1 in_XMM7 [16];
  vfloat4 v_22;
  float fVar211;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 in_XMM8 [16];
  vfloat4 v_2;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar222;
  float fVar223;
  float fVar232;
  float fVar234;
  undefined1 in_XMM9 [16];
  vfloat4 v_16;
  undefined1 auVar224 [16];
  float fVar233;
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar238;
  float fVar245;
  float fVar247;
  undefined1 in_XMM10 [16];
  vfloat4 v_12;
  undefined1 auVar239 [16];
  float fVar248;
  undefined1 auVar240 [16];
  float fVar246;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar249 [12];
  vfloat4 v_11;
  undefined1 auVar250 [12];
  undefined1 auVar251 [12];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar259;
  float fVar275;
  float fVar277;
  vfloat4 v;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar279;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  float fVar276;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  float fVar278;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar280;
  float fVar292;
  float fVar293;
  undefined1 in_XMM13 [16];
  vfloat4 v_1;
  float fVar294;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  float fVar295;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  float fVar296;
  float fVar297;
  float fVar307;
  float fVar309;
  undefined1 in_XMM14 [16];
  vfloat4 v_6;
  float fVar311;
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  float fVar308;
  float fVar310;
  float fVar312;
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar313;
  float fVar314;
  float fVar321;
  float fVar323;
  undefined1 in_XMM15 [16];
  vfloat4 v_15;
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  float fVar322;
  float fVar324;
  float fVar325;
  float fVar326;
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  vbool<4> vVar327;
  vfloat4 v_4;
  RayQueryContext newcontext;
  undefined1 local_288 [8];
  undefined8 uStack_280;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  undefined1 local_238 [8];
  undefined8 uStack_230;
  undefined1 local_228 [8];
  undefined8 uStack_220;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  undefined8 uStack_1e0;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  undefined8 uStack_1c0;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [12];
  int iStack_4c;
  RTCIntersectArguments *local_48;
  undefined1 local_38 [16];
  undefined8 local_28;
  undefined8 uStack_20;
  int iVar37;
  int iVar137;
  int iVar140;
  
  uVar2 = mm_lookupmask_ps._8_8_;
  v_16.field_0._0_12_ = in_XMM9._0_12_;
  v_15.field_0._0_12_ = in_XMM15._0_12_;
  v_2.field_0._0_12_ = in_XMM8._0_12_;
  v_12.field_0._0_12_ = in_XMM10._0_12_;
  uVar14 = prim->primID_;
  uVar38 = prim->instID_;
  pGVar8 = (context->scene->geometries).items[uVar38].ptr;
  p_Var7 = *(_func_int **)&pGVar8->field_0x58;
  if (p_Var7 == (_func_int *)0x0) {
    uVar15 = (ulong)*(uint *)(*(long *)&pGVar8[1].time_range.upper +
                             (long)pGVar8[1].intersectionFilterN * (ulong)uVar14);
    if (uVar15 == 0xffffffff) {
      p_Var7 = (_func_int *)0x0;
    }
    else {
      p_Var7 = pGVar8[1].super_RefCount._vptr_RefCount[uVar15];
    }
  }
  if (p_Var7 != (_func_int *)0x0) {
    uVar9 = pGVar8->mask;
    auVar121._0_4_ = -(uint)((uVar9 & *(uint *)(ray + 0x90)) == 0);
    auVar121._4_4_ = -(uint)((uVar9 & *(uint *)(ray + 0x94)) == 0);
    auVar121._8_4_ = -(uint)((uVar9 & *(uint *)(ray + 0x98)) == 0);
    auVar121._12_4_ = -(uint)((uVar9 & *(uint *)(ray + 0x9c)) == 0);
    auVar122 = ~auVar121 & (undefined1  [16])valid_i->field_0;
    auVar120 = auVar122._0_12_;
    uVar9 = movmskps((int)valid_i,auVar122);
    if (uVar9 != 0) {
      pRVar3 = context->user;
      *(undefined8 *)this = mm_lookupmask_ps._0_8_;
      *(undefined8 *)(this + 8) = uVar2;
      if (pRVar3->instID[0] == 0xffffffff) {
        pRVar3->instID[0] = uVar38;
        pRVar3->instPrimID[0] = uVar14;
        uVar15 = (ulong)prim->primID_;
        local_38 = auVar122;
        auVar121 = local_38;
        local_38._0_8_ = auVar122._0_8_;
        local_38._8_8_ = auVar122._8_8_;
        if ((pGVar8->field_8).field_0x1 == '\x01') {
          fVar259 = pGVar8->fnumTimeSegments;
          fVar275 = (pGVar8->time_range).lower;
          auVar261._0_4_ = (pGVar8->time_range).upper - fVar275;
          auVar299._4_4_ = fVar275;
          auVar299._0_4_ = fVar275;
          auVar299._8_4_ = fVar275;
          auVar299._12_4_ = fVar275;
          auVar214._4_4_ = fVar259;
          auVar214._0_4_ = fVar259;
          auVar214._8_4_ = fVar259;
          auVar214._12_4_ = fVar259;
          auVar316._0_4_ = *(float *)(ray + 0x70) - fVar275;
          auVar316._4_4_ = *(float *)(ray + 0x74) - fVar275;
          auVar316._8_4_ = *(float *)(ray + 0x78) - fVar275;
          auVar316._12_4_ = *(float *)(ray + 0x7c) - fVar275;
          auVar261._4_4_ = auVar261._0_4_;
          auVar261._8_4_ = auVar261._0_4_;
          auVar261._12_4_ = auVar261._0_4_;
          auVar254 = divps(auVar316,auVar261);
          auVar264._0_4_ = auVar254._0_4_ * fVar259;
          auVar264._4_4_ = auVar254._4_4_ * fVar259;
          auVar264._8_4_ = auVar254._8_4_ * fVar259;
          auVar264._12_4_ = auVar254._12_4_ * fVar259;
          auVar254 = roundps(auVar299,auVar264,1);
          auVar282._0_4_ = fVar259 + -1.0;
          auVar282._4_4_ = auVar282._0_4_;
          auVar282._8_4_ = auVar282._0_4_;
          auVar282._12_4_ = auVar282._0_4_;
          auVar254 = minps(auVar254,auVar282);
          auVar254 = maxps(auVar254,ZEXT816(0));
          auVar265._0_4_ = auVar264._0_4_ - auVar254._0_4_;
          auVar265._4_4_ = auVar264._4_4_ - auVar254._4_4_;
          auVar265._8_4_ = auVar264._8_4_ - auVar254._8_4_;
          auVar265._12_4_ = auVar264._12_4_ - auVar254._12_4_;
          local_58._0_4_ = (undefined4)auVar254._0_4_;
          local_58._4_4_ = (undefined4)auVar254._4_4_;
          local_58._8_4_ = (undefined4)auVar254._8_4_;
          iStack_4c = (int)auVar254._12_4_;
          lVar5 = 0;
          if ((uVar9 & 0xff) != 0) {
            for (; ((uVar9 & 0xff) >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
            }
          }
          iVar37 = *(int *)(local_58 + lVar5 * 4);
          auVar18._0_4_ = -(uint)(iVar37 == local_58._0_4_);
          auVar18._4_4_ = -(uint)(iVar37 == local_58._4_4_);
          auVar18._8_4_ = -(uint)(iVar37 == local_58._8_4_);
          auVar18._12_4_ = -(uint)(iVar37 == iStack_4c);
          iVar12 = movmskps((int)prim,~auVar18 & auVar122);
          if (iVar12 == 0) {
            lVar5 = *(long *)&pGVar8[1].fnumTimeSegments;
            lVar11 = (long)iVar37 * 0x38;
            plVar10 = (long *)(lVar5 + lVar11);
            iVar37 = *(int *)(lVar5 + 0x20 + lVar11);
            if (iVar37 == 0x9134) {
              lVar4 = *plVar10;
              lVar13 = plVar10[2] * uVar15;
              auVar122 = insertps(ZEXT416(*(uint *)(lVar4 + lVar13)),
                                  *(undefined4 *)(lVar4 + 0x10 + lVar13),0x1c);
              auVar261 = insertps(auVar122,*(undefined4 *)(lVar4 + 0x20 + lVar13),0x28);
              auVar122 = insertps(ZEXT416(*(uint *)(lVar4 + 4 + lVar13)),
                                  *(undefined4 *)(lVar4 + 0x14 + lVar13),0x1c);
              auVar269 = insertps(auVar122,*(undefined4 *)(lVar4 + 0x24 + lVar13),0x28);
              auVar122 = insertps(ZEXT416(*(uint *)(lVar4 + 8 + lVar13)),
                                  *(undefined4 *)(lVar4 + 0x18 + lVar13),0x1c);
              in_XMM13 = insertps(auVar122,*(undefined4 *)(lVar4 + 0x28 + lVar13),0x28);
              auVar122 = insertps(ZEXT416(*(uint *)(lVar4 + 0xc + lVar13)),
                                  *(undefined4 *)(lVar4 + 0x1c + lVar13),0x1c);
              in_XMM8 = insertps(auVar122,*(undefined4 *)(lVar4 + 0x2c + lVar13),0x28);
            }
            else if (iVar37 == 0x9234) {
              lVar4 = *plVar10;
              lVar13 = plVar10[2] * uVar15;
              uVar2 = *(undefined8 *)(lVar4 + 4 + lVar13);
              auVar261._4_4_ = (int)uVar2;
              auVar261._0_4_ = (float)*(undefined4 *)(lVar4 + lVar13);
              auVar261._8_4_ = (int)((ulong)uVar2 >> 0x20);
              auVar261._12_4_ = 0;
              uVar2 = *(undefined8 *)(lVar4 + 0x10 + lVar13);
              auVar269._4_4_ = (int)uVar2;
              auVar269._0_4_ = *(undefined4 *)(lVar4 + 0xc + lVar13);
              auVar269._8_4_ = (int)((ulong)uVar2 >> 0x20);
              auVar269._12_4_ = 0;
              uVar2 = *(undefined8 *)(lVar4 + 0x1c + lVar13);
              in_XMM13._4_4_ = (int)uVar2;
              in_XMM13._0_4_ = *(undefined4 *)(lVar4 + 0x18 + lVar13);
              in_XMM13._8_4_ = (int)((ulong)uVar2 >> 0x20);
              in_XMM13._12_4_ = 0;
              uVar2 = *(undefined8 *)(lVar4 + 0x28 + lVar13);
              in_XMM8._4_4_ = (int)uVar2;
              in_XMM8._0_4_ = *(undefined4 *)(lVar4 + 0x24 + lVar13);
              in_XMM8._8_4_ = (int)((ulong)uVar2 >> 0x20);
              in_XMM8._12_4_ = 0;
            }
            else if (iVar37 == 0xb001) {
              lVar4 = *plVar10;
              lVar13 = plVar10[2] * uVar15;
              auVar287._8_8_ = 0;
              auVar287._0_8_ = *(ulong *)(lVar4 + 0x10 + lVar13);
              auVar214 = insertps(auVar287,*(undefined4 *)(lVar4 + 8 + lVar13),0x20);
              uVar2 = *(undefined8 *)(lVar4 + 0x34 + lVar13);
              auVar200._4_4_ = (int)uVar2;
              auVar200._0_4_ = *(undefined4 *)(lVar4 + lVar13);
              auVar200._8_4_ = (int)((ulong)uVar2 >> 0x20);
              auVar200._12_4_ = 0;
              uVar2 = *(undefined8 *)(lVar4 + 0x1c + lVar13);
              auVar216._4_4_ = (int)uVar2;
              auVar216._0_4_ = *(undefined4 *)(lVar4 + 0x18 + lVar13);
              auVar216._8_4_ = (int)((ulong)uVar2 >> 0x20);
              auVar216._12_4_ = 0;
              fVar259 = *(float *)(lVar4 + 0x24 + lVar13);
              fVar275 = *(float *)(lVar4 + 0x28 + lVar13);
              fVar277 = *(float *)(lVar4 + 0x2c + lVar13);
              fVar279 = *(float *)(lVar4 + 0x30 + lVar13);
              fVar101 = fVar279 * fVar279 +
                        fVar277 * fVar277 + fVar259 * fVar259 + fVar275 * fVar275;
              auVar122 = rsqrtss(ZEXT416((uint)fVar101),ZEXT416((uint)fVar101));
              fVar100 = auVar122._0_4_;
              auVar126._4_12_ = auVar122._4_12_;
              fVar100 = fVar100 * fVar100 * fVar101 * -0.5 * fVar100 + fVar100 * 1.5;
              in_XMM8 = insertps(auVar216,ZEXT416((uint)(fVar259 * fVar100)),0x30);
              auVar261 = insertps(auVar200,ZEXT416((uint)(fVar275 * fVar100)),0x30);
              auVar126._0_4_ = fVar100 * fVar279;
              auVar122 = insertps(ZEXT416(*(uint *)(lVar4 + 0xc + lVar13)),
                                  *(undefined4 *)(lVar4 + 4 + lVar13),0x10);
              in_XMM13 = insertps(auVar214,auVar126,0x30);
              auVar122 = insertps(auVar122,*(undefined4 *)(lVar4 + 0x3c + lVar13),0x20);
              auVar269 = insertps(auVar122,ZEXT416((uint)(fVar277 * fVar100)),0x30);
            }
            else {
              auVar269 = auVar265;
              if (iVar37 == 0x9244) {
                lVar4 = *plVar10;
                lVar13 = plVar10[2] * uVar15;
                auVar261 = *(undefined1 (*) [16])(lVar4 + lVar13);
                auVar269 = *(undefined1 (*) [16])(lVar4 + 0x10 + lVar13);
                in_XMM13 = *(undefined1 (*) [16])(lVar4 + 0x20 + lVar13);
                in_XMM8 = *(undefined1 (*) [16])(lVar4 + 0x30 + lVar13);
              }
            }
            fVar279 = auVar261._0_4_;
            fVar100 = auVar261._4_4_;
            fVar101 = auVar261._8_4_;
            fVar259 = auVar261._12_4_;
            fVar246 = auVar269._0_4_;
            fVar182 = auVar269._4_4_;
            fVar192 = auVar269._8_4_;
            fVar277 = auVar269._12_4_;
            auVar256._4_4_ = fVar182;
            auVar256._0_4_ = fVar182;
            auVar256._8_4_ = fVar182;
            auVar256._12_4_ = fVar182;
            fVar194 = in_XMM13._0_4_;
            fVar113 = in_XMM13._4_4_;
            fVar117 = in_XMM13._8_4_;
            fVar114 = in_XMM13._12_4_;
            auVar226._4_4_ = fVar113;
            auVar226._0_4_ = fVar113;
            auVar226._8_4_ = fVar113;
            auVar226._12_4_ = fVar113;
            auVar242._4_4_ = fVar117;
            auVar242._0_4_ = fVar117;
            auVar242._8_4_ = fVar117;
            auVar242._12_4_ = fVar117;
            fVar112 = in_XMM8._0_4_;
            fVar77 = in_XMM8._4_4_;
            fVar184 = in_XMM8._8_4_;
            fVar275 = in_XMM8._12_4_;
            auVar202._4_4_ = fVar77;
            auVar202._0_4_ = fVar77;
            auVar202._8_4_ = fVar77;
            auVar202._12_4_ = fVar77;
            iVar37 = *(int *)(lVar5 + 0x58 + lVar11);
            if (iVar37 == 0x9134) {
              lVar5 = plVar10[7];
              lVar11 = uVar15 * plVar10[9];
              auVar122 = insertps(ZEXT416(*(uint *)(lVar5 + lVar11)),
                                  *(undefined4 *)(lVar5 + 0x10 + lVar11),0x1c);
              auVar242 = insertps(auVar122,*(undefined4 *)(lVar5 + 0x20 + lVar11),0x28);
              auVar122 = insertps(ZEXT416(*(uint *)(lVar5 + 4 + lVar11)),
                                  *(undefined4 *)(lVar5 + 0x14 + lVar11),0x1c);
              auVar226 = insertps(auVar122,*(undefined4 *)(lVar5 + 0x24 + lVar11),0x28);
              auVar122 = insertps(ZEXT416(*(uint *)(lVar5 + 8 + lVar11)),
                                  *(undefined4 *)(lVar5 + 0x18 + lVar11),0x1c);
              auVar202 = insertps(auVar122,*(undefined4 *)(lVar5 + 0x28 + lVar11),0x28);
              auVar122 = insertps(ZEXT416(*(uint *)(lVar5 + 0xc + lVar11)),
                                  *(undefined4 *)(lVar5 + 0x1c + lVar11),0x1c);
              auVar256 = insertps(auVar122,*(undefined4 *)(lVar5 + 0x2c + lVar11),0x28);
            }
            else if (iVar37 == 0x9234) {
              lVar5 = plVar10[7];
              lVar11 = uVar15 * plVar10[9];
              uVar2 = *(undefined8 *)(lVar5 + 4 + lVar11);
              auVar242._4_4_ = (int)uVar2;
              auVar242._0_4_ = *(undefined4 *)(lVar5 + lVar11);
              auVar242._8_4_ = (int)((ulong)uVar2 >> 0x20);
              auVar242._12_4_ = 0;
              uVar2 = *(undefined8 *)(lVar5 + 0x10 + lVar11);
              auVar226._4_4_ = (int)uVar2;
              auVar226._0_4_ = *(undefined4 *)(lVar5 + 0xc + lVar11);
              auVar226._8_4_ = (int)((ulong)uVar2 >> 0x20);
              auVar226._12_4_ = 0;
              uVar2 = *(undefined8 *)(lVar5 + 0x1c + lVar11);
              auVar202._4_4_ = (int)uVar2;
              auVar202._0_4_ = *(undefined4 *)(lVar5 + 0x18 + lVar11);
              auVar202._8_4_ = (int)((ulong)uVar2 >> 0x20);
              auVar202._12_4_ = 0;
              uVar2 = *(undefined8 *)(lVar5 + 0x28 + lVar11);
              auVar256._4_4_ = (int)uVar2;
              auVar256._0_4_ = *(undefined4 *)(lVar5 + 0x24 + lVar11);
              auVar256._8_4_ = (int)((ulong)uVar2 >> 0x20);
              auVar256._12_4_ = 0;
            }
            else if (iVar37 == 0xb001) {
              lVar5 = plVar10[7];
              lVar11 = uVar15 * plVar10[9];
              auVar201._8_8_ = 0;
              auVar201._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar11);
              auVar261 = insertps(auVar201,*(undefined4 *)(lVar5 + 8 + lVar11),0x20);
              uVar2 = *(undefined8 *)(lVar5 + 0x34 + lVar11);
              auVar241._4_4_ = (int)uVar2;
              auVar241._0_4_ = *(undefined4 *)(lVar5 + lVar11);
              auVar241._8_4_ = (int)((ulong)uVar2 >> 0x20);
              auVar241._12_4_ = 0;
              uVar2 = *(undefined8 *)(lVar5 + 0x1c + lVar11);
              auVar255._4_4_ = (int)uVar2;
              auVar255._0_4_ = *(undefined4 *)(lVar5 + 0x18 + lVar11);
              auVar255._8_4_ = (int)((ulong)uVar2 >> 0x20);
              auVar255._12_4_ = 0;
              fVar115 = *(float *)(lVar5 + 0x24 + lVar11);
              fVar116 = *(float *)(lVar5 + 0x28 + lVar11);
              fVar118 = *(float *)(lVar5 + 0x2c + lVar11);
              fVar119 = *(float *)(lVar5 + 0x30 + lVar11);
              fVar134 = fVar119 * fVar119 +
                        fVar118 * fVar118 + fVar115 * fVar115 + fVar116 * fVar116;
              auVar122 = rsqrtss(ZEXT416((uint)fVar134),ZEXT416((uint)fVar134));
              fVar133 = auVar122._0_4_;
              auVar127._4_12_ = auVar122._4_12_;
              fVar133 = fVar133 * fVar133 * fVar134 * -0.5 * fVar133 + fVar133 * 1.5;
              auVar256 = insertps(auVar255,ZEXT416((uint)(fVar115 * fVar133)),0x30);
              auVar242 = insertps(auVar241,ZEXT416((uint)(fVar116 * fVar133)),0x30);
              auVar127._0_4_ = fVar133 * fVar119;
              auVar122 = insertps(ZEXT416(*(uint *)(lVar5 + 0xc + lVar11)),
                                  *(undefined4 *)(lVar5 + 4 + lVar11),0x10);
              auVar202 = insertps(auVar261,auVar127,0x30);
              auVar122 = insertps(auVar122,*(undefined4 *)(lVar5 + 0x3c + lVar11),0x20);
              auVar226 = insertps(auVar122,ZEXT416((uint)(fVar118 * fVar133)),0x30);
            }
            else if (iVar37 == 0x9244) {
              lVar5 = plVar10[7];
              lVar11 = uVar15 * plVar10[9];
              auVar242 = *(undefined1 (*) [16])(lVar5 + lVar11);
              auVar226 = *(undefined1 (*) [16])(lVar5 + 0x10 + lVar11);
              auVar202 = *(undefined1 (*) [16])(lVar5 + 0x20 + lVar11);
              auVar256 = *(undefined1 (*) [16])(lVar5 + 0x30 + lVar11);
            }
            auVar243._12_4_ = auVar242._12_4_;
            auVar243._4_4_ = auVar243._12_4_;
            auVar243._0_4_ = auVar243._12_4_;
            auVar243._8_4_ = auVar243._12_4_;
            auVar257._12_4_ = auVar256._12_4_;
            auVar257._4_4_ = auVar257._12_4_;
            auVar257._0_4_ = auVar257._12_4_;
            auVar257._8_4_ = auVar257._12_4_;
            auVar227._12_4_ = auVar226._12_4_;
            auVar227._4_4_ = auVar227._12_4_;
            auVar227._0_4_ = auVar227._12_4_;
            auVar227._8_4_ = auVar227._12_4_;
            auVar203._12_4_ = auVar202._12_4_;
            auVar203._4_4_ = auVar203._12_4_;
            auVar203._0_4_ = auVar203._12_4_;
            auVar203._8_4_ = auVar203._12_4_;
            auVar105._0_4_ =
                 fVar114 * auVar203._12_4_ +
                 fVar277 * auVar227._12_4_ + fVar259 * auVar243._12_4_ + fVar275 * auVar257._12_4_;
            auVar105._4_4_ =
                 fVar114 * auVar203._12_4_ +
                 fVar277 * auVar227._12_4_ + fVar259 * auVar243._12_4_ + fVar275 * auVar257._12_4_;
            auVar105._8_4_ =
                 fVar114 * auVar203._12_4_ +
                 fVar277 * auVar227._12_4_ + fVar259 * auVar243._12_4_ + fVar275 * auVar257._12_4_;
            auVar105._12_4_ =
                 fVar114 * auVar203._12_4_ +
                 fVar277 * auVar227._12_4_ + fVar259 * auVar243._12_4_ + fVar275 * auVar257._12_4_;
            uVar15 = CONCAT44(auVar105._4_4_,auVar105._0_4_);
            auVar303._0_8_ = uVar15 ^ 0x8000000080000000;
            auVar303._8_4_ = -auVar105._8_4_;
            auVar303._12_4_ = -auVar105._12_4_;
            auVar20._4_4_ = -(uint)(auVar105._4_4_ < -auVar105._4_4_);
            auVar20._0_4_ = -(uint)(auVar105._0_4_ < -auVar105._0_4_);
            auVar20._8_4_ = -(uint)(auVar105._8_4_ < auVar303._8_4_);
            auVar20._12_4_ = -(uint)(auVar105._12_4_ < auVar303._12_4_);
            uVar15 = CONCAT44(auVar257._12_4_,auVar257._12_4_);
            auVar82._0_8_ = uVar15 ^ 0x8000000080000000;
            auVar82._8_4_ = -auVar257._12_4_;
            auVar82._12_4_ = -auVar257._12_4_;
            auVar282 = blendvps(auVar257,auVar82,auVar20);
            uVar15 = CONCAT44(auVar243._12_4_,auVar243._12_4_);
            auVar83._0_8_ = uVar15 ^ 0x8000000080000000;
            auVar83._8_4_ = -auVar243._12_4_;
            auVar83._12_4_ = -auVar243._12_4_;
            auVar254 = blendvps(auVar243,auVar83,auVar20);
            uVar15 = CONCAT44(auVar227._12_4_,auVar227._12_4_);
            auVar84._0_8_ = uVar15 ^ 0x8000000080000000;
            auVar84._8_4_ = -auVar227._12_4_;
            auVar84._12_4_ = -auVar227._12_4_;
            auVar214 = blendvps(auVar227,auVar84,auVar20);
            uVar15 = CONCAT44(auVar203._12_4_,auVar203._12_4_);
            auVar85._0_8_ = uVar15 ^ 0x8000000080000000;
            auVar85._8_4_ = -auVar203._12_4_;
            auVar85._12_4_ = -auVar203._12_4_;
            auVar261 = blendvps(auVar203,auVar85,auVar20);
            auVar299 = maxps(auVar303,auVar105);
            fVar115 = ABS(auVar105._0_4_);
            fVar116 = ABS(auVar105._4_4_);
            uVar15 = CONCAT44(auVar105._4_4_,auVar105._0_4_);
            auVar106._0_8_ = uVar15 & 0x7fffffff7fffffff;
            auVar106._8_4_ = ABS(auVar105._8_4_);
            auVar106._12_4_ = ABS(auVar105._12_4_);
            auVar86._0_4_ = 1.0 - fVar115;
            auVar86._4_4_ = 1.0 - fVar116;
            auVar86._8_4_ = 1.0 - auVar106._8_4_;
            auVar86._12_4_ = 1.0 - auVar106._12_4_;
            auVar122 = sqrtps(auVar86,auVar86);
            auVar21._0_4_ =
                 1.5707964 -
                 auVar122._0_4_ *
                 (((((fVar115 * -0.0043095737 + 0.0192803) * fVar115 + -0.04489909) * fVar115 +
                   0.08785567) * fVar115 + -0.21450998) * fVar115 + 1.5707952);
            auVar21._4_4_ =
                 1.5707964 -
                 auVar122._4_4_ *
                 (((((fVar116 * -0.0043095737 + 0.0192803) * fVar116 + -0.04489909) * fVar116 +
                   0.08785567) * fVar116 + -0.21450998) * fVar116 + 1.5707952);
            auVar21._8_4_ =
                 1.5707964 -
                 auVar122._8_4_ *
                 (((((auVar106._8_4_ * -0.0043095737 + 0.0192803) * auVar106._8_4_ + -0.04489909) *
                    auVar106._8_4_ + 0.08785567) * auVar106._8_4_ + -0.21450998) * auVar106._8_4_ +
                 1.5707952);
            auVar21._12_4_ =
                 1.5707964 -
                 auVar122._12_4_ *
                 (((((auVar106._12_4_ * -0.0043095737 + 0.0192803) * auVar106._12_4_ + -0.04489909)
                    * auVar106._12_4_ + 0.08785567) * auVar106._12_4_ + -0.21450998) *
                  auVar106._12_4_ + 1.5707952);
            auVar122 = maxps(ZEXT816(0),auVar21);
            fVar307 = auVar299._0_4_;
            fVar309 = auVar299._4_4_;
            fVar311 = auVar299._8_4_;
            fVar278 = auVar299._12_4_;
            auVar22._4_4_ = -(uint)(fVar309 < 0.0);
            auVar22._0_4_ = -(uint)(fVar307 < 0.0);
            auVar22._8_4_ = -(uint)(fVar311 < 0.0);
            auVar22._12_4_ = -(uint)(fVar278 < 0.0);
            auVar143._0_8_ = auVar122._0_8_ ^ 0x8000000080000000;
            auVar143._8_4_ = auVar122._8_4_ ^ 0x80000000;
            auVar143._12_4_ = auVar122._12_4_ ^ 0x80000000;
            auVar122 = blendvps(auVar122,auVar143,auVar22);
            auVar144._0_4_ = 1.5707964 - auVar122._0_4_;
            auVar144._4_4_ = 1.5707964 - auVar122._4_4_;
            auVar144._8_4_ = 1.5707964 - auVar122._8_4_;
            auVar144._12_4_ = 1.5707964 - auVar122._12_4_;
            auVar23._4_4_ = -(uint)(1.0 < fVar116);
            auVar23._0_4_ = -(uint)(1.0 < fVar115);
            auVar23._8_4_ = -(uint)(1.0 < auVar106._8_4_);
            auVar23._12_4_ = -(uint)(1.0 < auVar106._12_4_);
            auVar122 = blendvps(auVar144,_DAT_01ff1c40,auVar23);
            fVar115 = auVar122._0_4_ * auVar265._0_4_;
            fVar116 = auVar122._4_4_ * auVar265._4_4_;
            fVar118 = auVar122._8_4_ * auVar265._8_4_;
            fVar119 = auVar122._12_4_ * auVar265._12_4_;
            auVar24._0_4_ = fVar115 * 0.63661975;
            auVar24._4_4_ = fVar116 * 0.63661975;
            auVar24._8_4_ = fVar118 * 0.63661975;
            auVar24._12_4_ = fVar119 * 0.63661975;
            auVar122 = roundps(auVar106,auVar24,1);
            auVar25._0_8_ = CONCAT44((int)auVar122._4_4_,(int)auVar122._0_4_);
            auVar25._8_4_ = (int)auVar122._8_4_;
            auVar25._12_4_ = (int)auVar122._12_4_;
            fVar115 = fVar115 - auVar122._0_4_ * 1.5707964;
            fVar116 = fVar116 - auVar122._4_4_ * 1.5707964;
            fVar118 = fVar118 - auVar122._8_4_ * 1.5707964;
            fVar119 = fVar119 - auVar122._12_4_ * 1.5707964;
            auVar228._0_8_ = auVar25._0_8_ & 0x300000003;
            auVar228._8_8_ = auVar25._8_8_ & 0x300000003;
            fVar133 = fVar115 * fVar115;
            fVar134 = fVar116 * fVar116;
            fVar135 = fVar118 * fVar118;
            fVar136 = fVar119 * fVar119;
            uVar15 = auVar25._0_8_ & (ulong)DAT_01fecb20;
            uVar41 = auVar25._8_8_ & DAT_01fecb20._8_8_;
            iVar37 = (int)uVar15;
            auVar128._0_4_ = -(uint)(iVar37 == 0);
            iVar12 = (int)(uVar15 >> 0x20);
            auVar128._4_4_ = -(uint)(iVar12 == 0);
            iVar137 = (int)uVar41;
            iVar140 = (int)(uVar41 >> 0x20);
            auVar128._8_4_ = -(uint)(iVar137 == 0);
            auVar128._12_4_ = -(uint)(iVar140 == 0);
            auVar87._4_4_ = -iVar12;
            auVar87._0_4_ = -iVar37;
            auVar87._8_4_ = -iVar137;
            auVar87._12_4_ = -iVar140;
            auVar270._0_8_ =
                 CONCAT44((((((fVar134 * -2.5029328e-08 + 2.7600126e-06) * fVar134 + -0.00019842605)
                             * fVar134 + 0.008333348) * fVar134 + -0.16666667) * fVar134 + 1.0) *
                          fVar116,(((((fVar133 * -2.5029328e-08 + 2.7600126e-06) * fVar133 +
                                     -0.00019842605) * fVar133 + 0.008333348) * fVar133 +
                                   -0.16666667) * fVar133 + 1.0) * fVar115);
            auVar270._8_4_ =
                 (((((fVar135 * -2.5029328e-08 + 2.7600126e-06) * fVar135 + -0.00019842605) *
                    fVar135 + 0.008333348) * fVar135 + -0.16666667) * fVar135 + 1.0) * fVar118;
            auVar270._12_4_ =
                 (((((fVar136 * -2.5029328e-08 + 2.7600126e-06) * fVar136 + -0.00019842605) *
                    fVar136 + 0.008333348) * fVar136 + -0.16666667) * fVar136 + 1.0) * fVar119;
            auVar204._0_4_ =
                 ((((fVar133 * -2.5963018e-07 + 2.4756235e-05) * fVar133 + -0.001388833) * fVar133 +
                  0.04166664) * fVar133 + -0.5) * fVar133 + 1.0;
            auVar204._4_4_ =
                 ((((fVar134 * -2.5963018e-07 + 2.4756235e-05) * fVar134 + -0.001388833) * fVar134 +
                  0.04166664) * fVar134 + -0.5) * fVar134 + 1.0;
            auVar204._8_4_ =
                 ((((fVar135 * -2.5963018e-07 + 2.4756235e-05) * fVar135 + -0.001388833) * fVar135 +
                  0.04166664) * fVar135 + -0.5) * fVar135 + 1.0;
            auVar204._12_4_ =
                 ((((fVar136 * -2.5963018e-07 + 2.4756235e-05) * fVar136 + -0.001388833) * fVar136 +
                  0.04166664) * fVar136 + -0.5) * fVar136 + 1.0;
            auVar145._8_4_ = auVar270._8_4_;
            auVar145._0_8_ = auVar270._0_8_;
            auVar145._12_4_ = auVar270._12_4_;
            auVar122 = blendvps(auVar145,auVar204,auVar87);
            auVar299 = blendvps(auVar270,auVar204,auVar128);
            uVar39 = (uint)DAT_01fecb20;
            auVar26._0_4_ = -(uint)((int)uVar39 < (int)auVar228._0_8_);
            iVar37 = (int)(auVar228._0_8_ >> 0x20);
            uVar40 = DAT_01fecb20._4_4_;
            auVar26._4_4_ = -(uint)((int)uVar40 < iVar37);
            uVar43 = DAT_01fecb20._8_4_;
            iVar12 = (int)(auVar228._8_8_ >> 0x20);
            auVar26._8_4_ = -(uint)((int)uVar43 < (int)auVar228._8_8_);
            uVar44 = DAT_01fecb20._12_4_;
            auVar26._12_4_ = -(uint)((int)uVar44 < iVar12);
            auVar88._0_8_ = auVar122._0_8_ ^ 0x8000000080000000;
            auVar88._8_4_ = auVar122._8_4_ ^ 0x80000000;
            auVar88._12_4_ = auVar122._12_4_ ^ 0x80000000;
            auVar122 = blendvps(auVar122,auVar88,auVar26);
            uVar14 = (int)auVar228._0_8_ - 1;
            uVar38 = iVar37 - 1;
            uVar9 = (int)auVar228._8_8_ - 1;
            uVar42 = iVar12 - 1;
            auVar107._0_4_ =
                 -(uint)(((uVar14 < uVar39) * uVar14 | (uVar14 >= uVar39) * uVar39) == uVar14);
            auVar107._4_4_ =
                 -(uint)(((uVar38 < uVar40) * uVar38 | (uVar38 >= uVar40) * uVar40) == uVar38);
            auVar107._8_4_ =
                 -(uint)(((uVar9 < uVar43) * uVar9 | (uVar9 >= uVar43) * uVar43) == uVar9);
            auVar107._12_4_ =
                 -(uint)(((uVar42 < uVar44) * uVar42 | (uVar42 >= uVar44) * uVar44) == uVar42);
            auVar186._0_8_ = auVar299._0_8_ ^ 0x8000000080000000;
            auVar186._8_4_ = auVar299._8_4_ ^ 0x80000000;
            auVar186._12_4_ = auVar299._12_4_ ^ 0x80000000;
            auVar299 = blendvps(auVar299,auVar186,auVar107);
            fVar115 = fVar275 * fVar307 - auVar282._0_4_;
            fVar116 = fVar275 * fVar309 - auVar282._4_4_;
            fVar118 = fVar275 * fVar311 - auVar282._8_4_;
            fVar119 = fVar275 * fVar278 - auVar282._12_4_;
            local_88._0_4_ = auVar254._0_4_;
            local_88._4_4_ = auVar254._4_4_;
            fStack_80 = auVar254._8_4_;
            fStack_7c = auVar254._12_4_;
            fVar136 = fVar259 * fVar307 - (float)local_88._0_4_;
            fVar138 = fVar259 * fVar309 - (float)local_88._4_4_;
            fVar139 = fVar259 * fVar311 - fStack_80;
            fVar141 = fVar259 * fVar278 - fStack_7c;
            fVar180 = fVar277 * fVar307 - auVar214._0_4_;
            fVar181 = fVar277 * fVar309 - auVar214._4_4_;
            fVar183 = fVar277 * fVar311 - auVar214._8_4_;
            fVar191 = fVar277 * fVar278 - auVar214._12_4_;
            local_288._0_4_ = auVar261._0_4_;
            local_288._4_4_ = auVar261._4_4_;
            uStack_280._0_4_ = auVar261._8_4_;
            uStack_280._4_4_ = auVar261._12_4_;
            fVar232 = fVar114 * fVar307 - (float)local_288._0_4_;
            fVar233 = fVar114 * fVar309 - (float)local_288._4_4_;
            fVar234 = fVar114 * fVar311 - (float)uStack_280;
            fVar235 = fVar114 * fVar278 - uStack_280._4_4_;
            auVar89._0_4_ =
                 fVar232 * fVar232 + fVar180 * fVar180 + fVar136 * fVar136 + fVar115 * fVar115;
            auVar89._4_4_ =
                 fVar233 * fVar233 + fVar181 * fVar181 + fVar138 * fVar138 + fVar116 * fVar116;
            auVar89._8_4_ =
                 fVar234 * fVar234 + fVar183 * fVar183 + fVar139 * fVar139 + fVar118 * fVar118;
            auVar89._12_4_ =
                 fVar235 * fVar235 + fVar191 * fVar191 + fVar141 * fVar141 + fVar119 * fVar119;
            auVar261 = rsqrtps(auVar228,auVar89);
            fVar133 = auVar261._0_4_;
            fVar134 = auVar261._4_4_;
            fVar135 = auVar261._8_4_;
            fVar193 = auVar261._12_4_;
            fVar313 = fVar133 * 1.5 - fVar133 * fVar133 * auVar89._0_4_ * 0.5 * fVar133;
            fVar321 = fVar134 * 1.5 - fVar134 * fVar134 * auVar89._4_4_ * 0.5 * fVar134;
            fVar323 = fVar135 * 1.5 - fVar135 * fVar135 * auVar89._8_4_ * 0.5 * fVar135;
            fVar325 = fVar193 * 1.5 - fVar193 * fVar193 * auVar89._12_4_ * 0.5 * fVar193;
            fVar193 = auVar122._0_4_;
            fVar196 = auVar122._4_4_;
            fVar210 = auVar122._8_4_;
            fVar222 = auVar122._12_4_;
            fVar292 = auVar299._0_4_;
            fVar293 = auVar299._4_4_;
            fVar294 = auVar299._8_4_;
            fVar296 = auVar299._12_4_;
            local_258._4_4_ = fVar275 * fVar293 - fVar116 * fVar321 * fVar196;
            local_258._0_4_ = fVar275 * fVar292 - fVar115 * fVar313 * fVar193;
            fStack_250 = fVar275 * fVar294 - fVar118 * fVar323 * fVar210;
            fStack_24c = fVar275 * fVar296 - fVar119 * fVar325 * fVar222;
            fVar133 = (auVar282._0_4_ - fVar275) * auVar265._0_4_ + fVar275;
            fVar134 = (auVar282._4_4_ - fVar275) * auVar265._4_4_ + fVar275;
            fVar135 = (auVar282._8_4_ - fVar275) * auVar265._8_4_ + fVar275;
            fVar275 = (auVar282._12_4_ - fVar275) * auVar265._12_4_ + fVar275;
            fVar115 = ((float)local_88._0_4_ - fVar259) * auVar265._0_4_ + fVar259;
            fVar116 = ((float)local_88._4_4_ - fVar259) * auVar265._4_4_ + fVar259;
            fVar118 = (fStack_80 - fVar259) * auVar265._8_4_ + fVar259;
            fVar119 = (fStack_7c - fVar259) * auVar265._12_4_ + fVar259;
            fVar195 = (auVar214._0_4_ - fVar277) * auVar265._0_4_ + fVar277;
            fVar209 = (auVar214._4_4_ - fVar277) * auVar265._4_4_ + fVar277;
            fVar211 = (auVar214._8_4_ - fVar277) * auVar265._8_4_ + fVar277;
            fVar223 = (auVar214._12_4_ - fVar277) * auVar265._12_4_ + fVar277;
            auVar205._0_4_ = fVar195 * fVar195 + fVar115 * fVar115 + fVar133 * fVar133;
            auVar205._4_4_ = fVar209 * fVar209 + fVar116 * fVar116 + fVar134 * fVar134;
            auVar205._8_4_ = fVar211 * fVar211 + fVar118 * fVar118 + fVar135 * fVar135;
            auVar205._12_4_ = fVar223 * fVar223 + fVar119 * fVar119 + fVar275 * fVar275;
            fVar247 = ((float)local_288._0_4_ - fVar114) * auVar265._0_4_ + fVar114;
            fVar248 = ((float)local_288._4_4_ - fVar114) * auVar265._4_4_ + fVar114;
            fVar276 = ((float)uStack_280 - fVar114) * auVar265._8_4_ + fVar114;
            fVar280 = (uStack_280._4_4_ - fVar114) * auVar265._12_4_ + fVar114;
            auVar217._0_4_ = fVar247 * fVar247 + auVar205._0_4_;
            auVar217._4_4_ = fVar248 * fVar248 + auVar205._4_4_;
            auVar217._8_4_ = fVar276 * fVar276 + auVar205._8_4_;
            auVar217._12_4_ = fVar280 * fVar280 + auVar205._12_4_;
            auVar122 = rsqrtps(auVar205,auVar217);
            fVar236 = auVar122._0_4_;
            fVar237 = auVar122._4_4_;
            fVar238 = auVar122._8_4_;
            fVar245 = auVar122._12_4_;
            fVar236 = fVar236 * 1.5 - fVar236 * fVar236 * auVar217._0_4_ * 0.5 * fVar236;
            fVar237 = fVar237 * 1.5 - fVar237 * fVar237 * auVar217._4_4_ * 0.5 * fVar237;
            fVar238 = fVar238 * 1.5 - fVar238 * fVar238 * auVar217._8_4_ * 0.5 * fVar238;
            fVar245 = fVar245 * 1.5 - fVar245 * fVar245 * auVar217._12_4_ * 0.5 * fVar245;
            auVar90._0_4_ = fVar133 * fVar236;
            auVar90._4_4_ = fVar134 * fVar237;
            auVar90._8_4_ = fVar135 * fVar238;
            auVar90._12_4_ = fVar275 * fVar245;
            auVar27._4_4_ = -(uint)(0.9995 < fVar309);
            auVar27._0_4_ = -(uint)(0.9995 < fVar307);
            auVar27._8_4_ = -(uint)(0.9995 < fVar311);
            auVar27._12_4_ = -(uint)(0.9995 < fVar278);
            auVar122 = blendvps(_local_258,auVar90,auVar27);
            auVar206._0_4_ = fVar259 * fVar292 - fVar136 * fVar313 * fVar193;
            auVar206._4_4_ = fVar259 * fVar293 - fVar138 * fVar321 * fVar196;
            auVar206._8_4_ = fVar259 * fVar294 - fVar139 * fVar323 * fVar210;
            auVar206._12_4_ = fVar259 * fVar296 - fVar141 * fVar325 * fVar222;
            auVar70._0_4_ = fVar115 * fVar236;
            auVar70._4_4_ = fVar116 * fVar237;
            auVar70._8_4_ = fVar118 * fVar238;
            auVar70._12_4_ = fVar119 * fVar245;
            auVar261 = blendvps(auVar206,auVar70,auVar27);
            auVar218._0_4_ = fVar277 * fVar292 - fVar180 * fVar313 * fVar193;
            auVar218._4_4_ = fVar277 * fVar293 - fVar181 * fVar321 * fVar196;
            auVar218._8_4_ = fVar277 * fVar294 - fVar183 * fVar323 * fVar210;
            auVar218._12_4_ = fVar277 * fVar296 - fVar191 * fVar325 * fVar222;
            auVar146._0_4_ = fVar195 * fVar236;
            auVar146._4_4_ = fVar209 * fVar237;
            auVar146._8_4_ = fVar211 * fVar238;
            auVar146._12_4_ = fVar223 * fVar245;
            auVar214 = blendvps(auVar218,auVar146,auVar27);
            auVar271._0_4_ = fVar292 * fVar114 - fVar313 * fVar232 * fVar193;
            auVar271._4_4_ = fVar293 * fVar114 - fVar321 * fVar233 * fVar196;
            auVar271._8_4_ = fVar294 * fVar114 - fVar323 * fVar234 * fVar210;
            auVar271._12_4_ = fVar296 * fVar114 - fVar325 * fVar235 * fVar222;
            auVar258._0_4_ = fVar236 * fVar247;
            auVar258._4_4_ = fVar237 * fVar248;
            auVar258._8_4_ = fVar238 * fVar276;
            auVar258._12_4_ = fVar245 * fVar280;
            auVar254 = blendvps(auVar271,auVar258,auVar27);
            local_e8._0_4_ = auVar242._0_4_;
            fVar114 = 1.0 - auVar265._0_4_;
            fVar115 = 1.0 - auVar265._4_4_;
            fVar116 = 1.0 - auVar265._8_4_;
            fVar118 = 1.0 - auVar265._12_4_;
            fVar259 = fVar279 * fVar114 + (float)local_e8._0_4_ * auVar265._0_4_;
            fVar275 = fVar279 * fVar115 + (float)local_e8._0_4_ * auVar265._4_4_;
            fVar277 = fVar279 * fVar116 + (float)local_e8._0_4_ * auVar265._8_4_;
            fVar279 = fVar279 * fVar118 + (float)local_e8._0_4_ * auVar265._12_4_;
            local_d8._4_4_ = auVar242._4_4_;
            local_248._4_4_ = fVar100 * fVar115 + (float)local_d8._4_4_ * auVar265._4_4_;
            local_248._0_4_ = fVar100 * fVar114 + (float)local_d8._4_4_ * auVar265._0_4_;
            uStack_240._0_4_ = fVar100 * fVar116 + (float)local_d8._4_4_ * auVar265._8_4_;
            uStack_240._4_4_ = fVar100 * fVar118 + (float)local_d8._4_4_ * auVar265._12_4_;
            fStack_120 = auVar242._8_4_;
            local_228._4_4_ = fVar101 * fVar115 + fStack_120 * auVar265._4_4_;
            local_228._0_4_ = fVar101 * fVar114 + fStack_120 * auVar265._0_4_;
            uStack_220._0_4_ = fVar101 * fVar116 + fStack_120 * auVar265._8_4_;
            uStack_220._4_4_ = fVar101 * fVar118 + fStack_120 * auVar265._12_4_;
            local_78._0_4_ = auVar226._0_4_;
            local_278._4_4_ = fVar246 * fVar115 + (float)local_78._0_4_ * auVar265._4_4_;
            local_278._0_4_ = fVar246 * fVar114 + (float)local_78._0_4_ * auVar265._0_4_;
            fStack_270 = fVar246 * fVar116 + (float)local_78._0_4_ * auVar265._8_4_;
            fStack_26c = fVar246 * fVar118 + (float)local_78._0_4_ * auVar265._12_4_;
            local_68._4_4_ = auVar226._4_4_;
            local_1d8._4_4_ = fVar182 * fVar115 + (float)local_68._4_4_ * auVar265._4_4_;
            local_1d8._0_4_ = fVar182 * fVar114 + (float)local_68._4_4_ * auVar265._0_4_;
            fStack_1d0 = fVar182 * fVar116 + (float)local_68._4_4_ * auVar265._8_4_;
            fStack_1cc = fVar182 * fVar118 + (float)local_68._4_4_ * auVar265._12_4_;
            fStack_160 = auVar226._8_4_;
            local_238._4_4_ = fVar192 * fVar115 + fStack_160 * auVar265._4_4_;
            local_238._0_4_ = fVar192 * fVar114 + fStack_160 * auVar265._0_4_;
            uStack_230._0_4_ = fVar192 * fVar116 + fStack_160 * auVar265._8_4_;
            uStack_230._4_4_ = fVar192 * fVar118 + fStack_160 * auVar265._12_4_;
            local_158._0_4_ = auVar202._0_4_;
            local_268._4_4_ = fVar194 * fVar115 + (float)local_158._0_4_ * auVar265._4_4_;
            local_268._0_4_ = fVar194 * fVar114 + (float)local_158._0_4_ * auVar265._0_4_;
            fStack_260 = fVar194 * fVar116 + (float)local_158._0_4_ * auVar265._8_4_;
            fStack_25c = fVar194 * fVar118 + (float)local_158._0_4_ * auVar265._12_4_;
            local_138._4_4_ = auVar202._4_4_;
            fStack_c0 = auVar202._8_4_;
            local_188._0_4_ = auVar256._0_4_;
            local_148._4_4_ = auVar256._4_4_;
            fStack_110 = auVar256._8_4_;
            local_1a8._4_4_ = fVar113 * fVar115 + (float)local_138._4_4_ * auVar265._4_4_;
            local_1a8._0_4_ = fVar113 * fVar114 + (float)local_138._4_4_ * auVar265._0_4_;
            fStack_1a0 = fVar113 * fVar116 + (float)local_138._4_4_ * auVar265._8_4_;
            fStack_19c = fVar113 * fVar118 + (float)local_138._4_4_ * auVar265._12_4_;
            local_1b8._4_4_ = fVar117 * fVar115 + fStack_c0 * auVar265._4_4_;
            local_1b8._0_4_ = fVar117 * fVar114 + fStack_c0 * auVar265._0_4_;
            fStack_1b0 = fVar117 * fVar116 + fStack_c0 * auVar265._8_4_;
            fStack_1ac = fVar117 * fVar118 + fStack_c0 * auVar265._12_4_;
            local_1e8._4_4_ = fVar112 * fVar115 + (float)local_188._0_4_ * auVar265._4_4_;
            local_1e8._0_4_ = fVar112 * fVar114 + (float)local_188._0_4_ * auVar265._0_4_;
            uStack_1e0._0_4_ = fVar112 * fVar116 + (float)local_188._0_4_ * auVar265._8_4_;
            uStack_1e0._4_4_ = fVar112 * fVar118 + (float)local_188._0_4_ * auVar265._12_4_;
            local_198._4_4_ = fVar77 * fVar115 + (float)local_148._4_4_ * auVar265._4_4_;
            local_198._0_4_ = fVar77 * fVar114 + (float)local_148._4_4_ * auVar265._0_4_;
            fStack_190 = fVar77 * fVar116 + (float)local_148._4_4_ * auVar265._8_4_;
            fStack_18c = fVar77 * fVar118 + (float)local_148._4_4_ * auVar265._12_4_;
            local_1f8._4_4_ = fVar115 * fVar184 + fStack_110 * auVar265._4_4_;
            local_1f8._0_4_ = fVar114 * fVar184 + fStack_110 * auVar265._0_4_;
            fStack_1f0 = fVar116 * fVar184 + fStack_110 * auVar265._8_4_;
            fStack_1ec = fVar118 * fVar184 + fStack_110 * auVar265._12_4_;
            fVar115 = auVar261._0_4_;
            fVar116 = auVar261._4_4_;
            fVar119 = auVar261._12_4_;
            local_258._0_4_ = auVar122._0_4_;
            local_258._4_4_ = auVar122._4_4_;
            fStack_250 = auVar122._8_4_;
            fStack_24c = auVar122._12_4_;
            fVar118 = auVar261._8_4_;
            fVar134 = auVar214._0_4_;
            fVar136 = auVar214._4_4_;
            fVar139 = auVar214._8_4_;
            fVar180 = auVar214._12_4_;
            fVar184 = auVar254._0_4_;
            fVar182 = auVar254._4_4_;
            fVar194 = auVar254._8_4_;
            fVar117 = auVar254._12_4_;
            fVar100 = fVar115 * fVar134 + (float)local_258._0_4_ * fVar184;
            fVar101 = fVar116 * fVar136 + (float)local_258._4_4_ * fVar182;
            fVar112 = fVar118 * fVar139 + fStack_250 * fVar194;
            fVar77 = fVar119 * fVar180 + fStack_24c * fVar117;
            fVar237 = fVar115 * fVar134 - (float)local_258._0_4_ * fVar184;
            fVar238 = fVar116 * fVar136 - (float)local_258._4_4_ * fVar182;
            fVar245 = fVar118 * fVar139 - fStack_250 * fVar194;
            fVar247 = fVar119 * fVar180 - fStack_24c * fVar117;
            fVar211 = fVar134 * fVar134;
            fVar222 = fVar136 * fVar136;
            fVar223 = fVar139 * fVar139;
            fVar232 = fVar180 * fVar180;
            fVar246 = (float)local_258._0_4_ * (float)local_258._0_4_ - fVar115 * fVar115;
            fVar192 = (float)local_258._4_4_ * (float)local_258._4_4_ - fVar116 * fVar116;
            fVar113 = fStack_250 * fStack_250 - fVar118 * fVar118;
            fVar114 = fStack_24c * fStack_24c - fVar119 * fVar119;
            fVar133 = fVar115 * fVar184 - (float)local_258._0_4_ * fVar134;
            fVar135 = fVar116 * fVar182 - (float)local_258._4_4_ * fVar136;
            fVar138 = fVar118 * fVar194 - fStack_250 * fVar139;
            fVar141 = fVar119 * fVar117 - fStack_24c * fVar180;
            fVar181 = (float)local_258._0_4_ * fVar134 + fVar115 * fVar184;
            fVar183 = (float)local_258._4_4_ * fVar136 + fVar116 * fVar182;
            fVar191 = fStack_250 * fVar139 + fVar118 * fVar194;
            fVar193 = fStack_24c * fVar180 + fVar119 * fVar117;
            fVar195 = fVar184 * fVar134 + fVar115 * (float)local_258._0_4_;
            fVar196 = fVar182 * fVar136 + fVar116 * (float)local_258._4_4_;
            fVar209 = fVar194 * fVar139 + fVar118 * fStack_250;
            fVar210 = fVar117 * fVar180 + fVar119 * fStack_24c;
            fVar134 = fVar184 * fVar134 - fVar115 * (float)local_258._0_4_;
            fVar136 = fVar182 * fVar136 - fVar116 * (float)local_258._4_4_;
            fVar139 = fVar194 * fVar139 - fVar118 * fStack_250;
            fVar180 = fVar117 * fVar180 - fVar119 * fStack_24c;
            fVar184 = fVar184 * fVar184;
            fVar182 = fVar182 * fVar182;
            fVar194 = fVar194 * fVar194;
            fVar117 = fVar117 * fVar117;
            fVar233 = (((float)local_258._0_4_ * (float)local_258._0_4_ + fVar115 * fVar115) -
                      fVar211) - fVar184;
            fVar234 = (((float)local_258._4_4_ * (float)local_258._4_4_ + fVar116 * fVar116) -
                      fVar222) - fVar182;
            fVar235 = ((fStack_250 * fStack_250 + fVar118 * fVar118) - fVar223) - fVar194;
            fVar236 = ((fStack_24c * fStack_24c + fVar119 * fVar119) - fVar232) - fVar117;
            fVar115 = (fVar211 + fVar246) - fVar184;
            fVar116 = (fVar222 + fVar192) - fVar182;
            fVar118 = (fVar223 + fVar113) - fVar194;
            fVar119 = (fVar232 + fVar114) - fVar117;
            fVar184 = (fVar246 - fVar211) + fVar184;
            fVar182 = (fVar192 - fVar222) + fVar182;
            fVar194 = (fVar113 - fVar223) + fVar194;
            fVar117 = (fVar114 - fVar232) + fVar117;
          }
          else {
            if (uVar9 != 0) {
              lVar5 = *(long *)&pGVar8[1].fnumTimeSegments;
              auVar272 = auVar265;
              _local_288 = auVar122;
              do {
                lVar11 = 0;
                if ((uVar9 & 0xf) != 0) {
                  for (; ((uVar9 & 0xf) >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                  }
                }
                iVar37 = *(int *)(local_58 + (long)(int)lVar11 * 4);
                auVar29._0_4_ = -(uint)(iVar37 == local_58._0_4_);
                auVar29._4_4_ = -(uint)(iVar37 == local_58._4_4_);
                auVar29._8_4_ = -(uint)(iVar37 == local_58._8_4_);
                auVar29._12_4_ = -(uint)(iVar37 == iStack_4c);
                auVar29 = auVar29 & _local_288;
                lVar11 = (long)iVar37 * 0x38;
                plVar10 = (long *)(lVar5 + lVar11);
                iVar37 = *(int *)(lVar5 + 0x20 + lVar11);
                if (iVar37 == 0x9134) {
                  lVar4 = *plVar10;
                  lVar13 = plVar10[2] * uVar15;
                  auVar261 = insertps(ZEXT416(*(uint *)(lVar4 + lVar13)),
                                      *(undefined4 *)(lVar4 + 0x10 + lVar13),0x1c);
                  in_XMM8 = insertps(auVar261,*(undefined4 *)(lVar4 + 0x20 + lVar13),0x28);
                  auVar261 = insertps(ZEXT416(*(uint *)(lVar4 + 4 + lVar13)),
                                      *(undefined4 *)(lVar4 + 0x14 + lVar13),0x1c);
                  auVar272 = insertps(auVar261,*(undefined4 *)(lVar4 + 0x24 + lVar13),0x28);
                  auVar261 = insertps(ZEXT416(*(uint *)(lVar4 + 8 + lVar13)),
                                      *(undefined4 *)(lVar4 + 0x18 + lVar13),0x1c);
                  local_108 = insertps(auVar261,*(undefined4 *)(lVar4 + 0x28 + lVar13),0x28);
                  auVar261 = insertps(ZEXT416(*(uint *)(lVar4 + 0xc + lVar13)),
                                      *(undefined4 *)(lVar4 + 0x1c + lVar13),0x1c);
                  auVar261 = insertps(auVar261,*(undefined4 *)(lVar4 + 0x2c + lVar13),0x28);
                }
                else if (iVar37 == 0x9234) {
                  lVar4 = *plVar10;
                  lVar13 = plVar10[2] * uVar15;
                  uVar2 = *(undefined8 *)(lVar4 + 4 + lVar13);
                  in_XMM8._4_4_ = (int)uVar2;
                  in_XMM8._0_4_ = *(undefined4 *)(lVar4 + lVar13);
                  in_XMM8._8_4_ = (int)((ulong)uVar2 >> 0x20);
                  in_XMM8._12_4_ = 0;
                  uVar2 = *(undefined8 *)(lVar4 + 0x10 + lVar13);
                  auVar272._4_4_ = (int)uVar2;
                  auVar272._0_4_ = *(undefined4 *)(lVar4 + 0xc + lVar13);
                  auVar272._8_4_ = (int)((ulong)uVar2 >> 0x20);
                  auVar272._12_4_ = 0;
                  uVar2 = *(undefined8 *)(lVar4 + 0x1c + lVar13);
                  local_108._4_4_ = (int)uVar2;
                  local_108._0_4_ = *(undefined4 *)(lVar4 + 0x18 + lVar13);
                  local_108._8_4_ = (int)((ulong)uVar2 >> 0x20);
                  local_108._12_4_ = 0;
                  uVar2 = *(undefined8 *)(lVar4 + 0x28 + lVar13);
                  auVar261._4_4_ = (int)uVar2;
                  auVar261._0_4_ = (float)*(undefined4 *)(lVar4 + 0x24 + lVar13);
                  auVar261._8_4_ = (int)((ulong)uVar2 >> 0x20);
                  auVar261._12_4_ = 0;
                }
                else if (iVar37 == 0xb001) {
                  lVar4 = *plVar10;
                  lVar13 = plVar10[2] * uVar15;
                  auVar188._8_8_ = 0;
                  auVar188._0_8_ = *(ulong *)(lVar4 + 0x10 + lVar13);
                  auVar282 = insertps(auVar188,*(undefined4 *)(lVar4 + 8 + lVar13),0x20);
                  uVar2 = *(undefined8 *)(lVar4 + 0x34 + lVar13);
                  auVar220._4_4_ = (int)uVar2;
                  auVar220._0_4_ = *(undefined4 *)(lVar4 + lVar13);
                  auVar220._8_4_ = (int)((ulong)uVar2 >> 0x20);
                  auVar220._12_4_ = 0;
                  uVar2 = *(undefined8 *)(lVar4 + 0x1c + lVar13);
                  auVar91._4_4_ = (int)uVar2;
                  auVar91._0_4_ = *(undefined4 *)(lVar4 + 0x18 + lVar13);
                  auVar91._8_4_ = (int)((ulong)uVar2 >> 0x20);
                  auVar91._12_4_ = 0;
                  fVar259 = *(float *)(lVar4 + 0x24 + lVar13);
                  fVar275 = *(float *)(lVar4 + 0x28 + lVar13);
                  fVar277 = *(float *)(lVar4 + 0x2c + lVar13);
                  fVar279 = *(float *)(lVar4 + 0x30 + lVar13);
                  fVar101 = fVar279 * fVar279 +
                            fVar277 * fVar277 + fVar259 * fVar259 + fVar275 * fVar275;
                  auVar299 = rsqrtss(ZEXT416((uint)fVar101),ZEXT416((uint)fVar101));
                  fVar100 = auVar299._0_4_;
                  fVar100 = fVar100 * fVar100 * fVar101 * -0.5 * fVar100 + fVar100 * 1.5;
                  auVar261 = insertps(auVar91,ZEXT416((uint)(fVar259 * fVar100)),0x30);
                  in_XMM8 = insertps(auVar220,ZEXT416((uint)(fVar275 * fVar100)),0x30);
                  auVar289._0_4_ = fVar100 * fVar279;
                  auVar289._4_12_ = auVar299._4_12_;
                  auVar299 = insertps(ZEXT416(*(uint *)(lVar4 + 0xc + lVar13)),
                                      *(undefined4 *)(lVar4 + 4 + lVar13),0x10);
                  local_108 = insertps(auVar282,auVar289,0x30);
                  auVar282 = insertps(auVar299,*(undefined4 *)(lVar4 + 0x3c + lVar13),0x20);
                  auVar272 = insertps(auVar282,ZEXT416((uint)(fVar277 * fVar100)),0x30);
                }
                else if (iVar37 == 0x9244) {
                  lVar4 = *plVar10;
                  lVar13 = plVar10[2] * uVar15;
                  in_XMM8 = *(undefined1 (*) [16])(lVar4 + lVar13);
                  auVar272 = *(undefined1 (*) [16])(lVar4 + 0x10 + lVar13);
                  local_108 = *(undefined1 (*) [16])(lVar4 + 0x20 + lVar13);
                  auVar261 = *(undefined1 (*) [16])(lVar4 + 0x30 + lVar13);
                }
                uVar45 = in_XMM8._0_4_;
                uVar75 = in_XMM8._4_4_;
                uVar76 = in_XMM8._8_4_;
                uVar78 = in_XMM8._12_4_;
                auVar148._4_4_ = uVar45;
                auVar148._0_4_ = uVar45;
                auVar148._8_4_ = uVar45;
                auVar148._12_4_ = uVar45;
                _local_1c8 = blendvps(_local_1c8,auVar148,auVar29);
                auVar149._4_4_ = uVar75;
                auVar149._0_4_ = uVar75;
                auVar149._8_4_ = uVar75;
                auVar149._12_4_ = uVar75;
                _local_248 = blendvps(_local_248,auVar149,auVar29);
                auVar150._4_4_ = uVar76;
                auVar150._0_4_ = uVar76;
                auVar150._8_4_ = uVar76;
                auVar150._12_4_ = uVar76;
                _local_228 = blendvps(_local_228,auVar150,auVar29);
                auVar151._4_4_ = uVar78;
                auVar151._0_4_ = uVar78;
                auVar151._8_4_ = uVar78;
                auVar151._12_4_ = uVar78;
                _local_1f8 = blendvps(_local_1f8,auVar151,auVar29);
                uVar45 = auVar272._0_4_;
                uVar75 = auVar272._4_4_;
                uVar76 = auVar272._8_4_;
                uVar78 = auVar272._12_4_;
                auVar152._4_4_ = uVar45;
                auVar152._0_4_ = uVar45;
                auVar152._8_4_ = uVar45;
                auVar152._12_4_ = uVar45;
                _local_278 = blendvps(_local_278,auVar152,auVar29);
                auVar153._4_4_ = uVar75;
                auVar153._0_4_ = uVar75;
                auVar153._8_4_ = uVar75;
                auVar153._12_4_ = uVar75;
                _local_1d8 = blendvps(_local_1d8,auVar153,auVar29);
                auVar154._4_4_ = uVar76;
                auVar154._0_4_ = uVar76;
                auVar154._8_4_ = uVar76;
                auVar154._12_4_ = uVar76;
                _local_238 = blendvps(_local_238,auVar154,auVar29);
                auVar155._4_4_ = uVar78;
                auVar155._0_4_ = uVar78;
                auVar155._8_4_ = uVar78;
                auVar155._12_4_ = uVar78;
                _local_218 = blendvps(_local_218,auVar155,auVar29);
                auVar156._4_4_ = local_108._0_4_;
                auVar156._0_4_ = local_108._0_4_;
                auVar156._8_4_ = local_108._0_4_;
                auVar156._12_4_ = local_108._0_4_;
                _local_268 = blendvps(_local_268,auVar156,auVar29);
                auVar157._4_4_ = local_108._4_4_;
                auVar157._0_4_ = local_108._4_4_;
                auVar157._8_4_ = local_108._4_4_;
                auVar157._12_4_ = local_108._4_4_;
                _local_1a8 = blendvps(_local_1a8,auVar157,auVar29);
                auVar158._4_4_ = local_108._8_4_;
                auVar158._0_4_ = local_108._8_4_;
                auVar158._8_4_ = local_108._8_4_;
                auVar158._12_4_ = local_108._8_4_;
                _local_1b8 = blendvps(_local_1b8,auVar158,auVar29);
                auVar159._4_4_ = local_108._12_4_;
                auVar159._0_4_ = local_108._12_4_;
                auVar159._8_4_ = local_108._12_4_;
                auVar159._12_4_ = local_108._12_4_;
                _local_208 = blendvps(_local_208,auVar159,auVar29);
                uVar45 = auVar261._0_4_;
                uVar75 = auVar261._4_4_;
                uVar76 = auVar261._8_4_;
                uVar78 = auVar261._12_4_;
                auVar160._4_4_ = uVar45;
                auVar160._0_4_ = uVar45;
                auVar160._8_4_ = uVar45;
                auVar160._12_4_ = uVar45;
                _local_1e8 = blendvps(_local_1e8,auVar160,auVar29);
                auVar161._4_4_ = uVar75;
                auVar161._0_4_ = uVar75;
                auVar161._8_4_ = uVar75;
                auVar161._12_4_ = uVar75;
                _local_198 = blendvps(_local_198,auVar161,auVar29);
                auVar162._4_4_ = uVar76;
                auVar162._0_4_ = uVar76;
                auVar162._8_4_ = uVar76;
                auVar162._12_4_ = uVar76;
                _local_128 = blendvps(_local_128,auVar162,auVar29);
                auVar163._4_4_ = uVar78;
                auVar163._0_4_ = uVar78;
                auVar163._8_4_ = uVar78;
                auVar163._12_4_ = uVar78;
                _local_148 = blendvps(_local_148,auVar163,auVar29);
                _local_288 = _local_288 ^ auVar29;
                iVar37 = *(int *)(lVar5 + 0x58 + lVar11);
                if (iVar37 == 0x9134) {
                  lVar11 = plVar10[7];
                  plVar10 = (long *)(plVar10[9] * uVar15);
                  auVar122 = insertps(ZEXT416(*(uint *)(lVar11 + (long)plVar10)),
                                      *(undefined4 *)(lVar11 + 0x10 + (long)plVar10),0x1c);
                  in_XMM14 = insertps(auVar122,*(undefined4 *)(lVar11 + 0x20 + (long)plVar10),0x28);
                  auVar122 = insertps(ZEXT416(*(uint *)(lVar11 + 4 + (long)plVar10)),
                                      *(undefined4 *)(lVar11 + 0x14 + (long)plVar10),0x1c);
                  auVar214 = insertps(auVar122,*(undefined4 *)(lVar11 + 0x24 + (long)plVar10),0x28);
                  auVar122 = insertps(ZEXT416(*(uint *)(lVar11 + 8 + (long)plVar10)),
                                      *(undefined4 *)(lVar11 + 0x18 + (long)plVar10),0x1c);
                  auVar254 = insertps(auVar122,*(undefined4 *)(lVar11 + 0x28 + (long)plVar10),0x28);
                  auVar122 = insertps(ZEXT416(*(uint *)(lVar11 + 0xc + (long)plVar10)),
                                      *(undefined4 *)(lVar11 + 0x1c + (long)plVar10),0x1c);
                  auVar122 = insertps(auVar122,*(undefined4 *)(lVar11 + 0x2c + (long)plVar10),0x28);
                }
                else if (iVar37 == 0x9234) {
                  lVar11 = plVar10[7];
                  plVar10 = (long *)(plVar10[9] * uVar15);
                  uVar2 = *(undefined8 *)(lVar11 + 4 + (long)plVar10);
                  in_XMM14._4_4_ = (int)uVar2;
                  in_XMM14._0_4_ = *(undefined4 *)(lVar11 + (long)plVar10);
                  in_XMM14._8_4_ = (int)((ulong)uVar2 >> 0x20);
                  in_XMM14._12_4_ = 0;
                  uVar2 = *(undefined8 *)(lVar11 + 0x10 + (long)plVar10);
                  auVar214._4_4_ = (int)uVar2;
                  auVar214._0_4_ = *(undefined4 *)(lVar11 + 0xc + (long)plVar10);
                  auVar214._8_4_ = (int)((ulong)uVar2 >> 0x20);
                  auVar214._12_4_ = 0;
                  uVar2 = *(undefined8 *)(lVar11 + 0x1c + (long)plVar10);
                  auVar254._4_4_ = (int)uVar2;
                  auVar254._0_4_ = *(undefined4 *)(lVar11 + 0x18 + (long)plVar10);
                  auVar254._8_4_ = (int)((ulong)uVar2 >> 0x20);
                  auVar254._12_4_ = 0;
                  uVar2 = *(undefined8 *)(lVar11 + 0x28 + (long)plVar10);
                  auVar122._4_4_ = (int)uVar2;
                  auVar122._0_4_ = *(undefined4 *)(lVar11 + 0x24 + (long)plVar10);
                  auVar122._8_4_ = (int)((ulong)uVar2 >> 0x20);
                  auVar122._12_4_ = 0;
                }
                else if (iVar37 == 0xb001) {
                  lVar11 = plVar10[7];
                  plVar10 = (long *)(plVar10[9] * uVar15);
                  auVar71._8_8_ = 0;
                  auVar71._0_8_ = *(ulong *)(lVar11 + 0x10 + (long)plVar10);
                  auVar214 = insertps(auVar71,*(undefined4 *)(lVar11 + 8 + (long)plVar10),0x20);
                  uVar2 = *(undefined8 *)(lVar11 + 0x34 + (long)plVar10);
                  auVar305._4_4_ = (int)uVar2;
                  auVar305._0_4_ = *(undefined4 *)(lVar11 + (long)plVar10);
                  auVar305._8_4_ = (int)((ulong)uVar2 >> 0x20);
                  auVar305._12_4_ = 0;
                  uVar2 = *(undefined8 *)(lVar11 + 0x1c + (long)plVar10);
                  auVar130._4_4_ = (int)uVar2;
                  auVar130._0_4_ = *(undefined4 *)(lVar11 + 0x18 + (long)plVar10);
                  auVar130._8_4_ = (int)((ulong)uVar2 >> 0x20);
                  auVar130._12_4_ = 0;
                  fVar259 = *(float *)(lVar11 + 0x24 + (long)plVar10);
                  fVar275 = *(float *)(lVar11 + 0x28 + (long)plVar10);
                  fVar277 = *(float *)(lVar11 + 0x2c + (long)plVar10);
                  fVar279 = *(float *)(lVar11 + 0x30 + (long)plVar10);
                  fVar101 = fVar279 * fVar279 +
                            fVar277 * fVar277 + fVar259 * fVar259 + fVar275 * fVar275;
                  auVar254 = rsqrtss(ZEXT416((uint)fVar101),ZEXT416((uint)fVar101));
                  fVar100 = auVar254._0_4_;
                  fVar100 = fVar100 * fVar100 * fVar101 * -0.5 * fVar100 + fVar100 * 1.5;
                  auVar122 = insertps(auVar130,ZEXT416((uint)(fVar259 * fVar100)),0x30);
                  in_XMM14 = insertps(auVar305,ZEXT416((uint)(fVar275 * fVar100)),0x30);
                  auVar290._0_4_ = fVar100 * fVar279;
                  auVar290._4_12_ = auVar254._4_12_;
                  auVar282 = insertps(ZEXT416(*(uint *)(lVar11 + 0xc + (long)plVar10)),
                                      *(undefined4 *)(lVar11 + 4 + (long)plVar10),0x10);
                  auVar254 = insertps(auVar214,auVar290,0x30);
                  auVar214 = insertps(auVar282,*(undefined4 *)(lVar11 + 0x3c + (long)plVar10),0x20);
                  auVar214 = insertps(auVar214,ZEXT416((uint)(fVar277 * fVar100)),0x30);
                }
                else if (iVar37 == 0x9244) {
                  lVar11 = plVar10[7];
                  plVar10 = (long *)(plVar10[9] * uVar15);
                  in_XMM14 = *(undefined1 (*) [16])(lVar11 + (long)plVar10);
                  auVar214 = *(undefined1 (*) [16])(lVar11 + 0x10 + (long)plVar10);
                  auVar254 = *(undefined1 (*) [16])(lVar11 + 0x20 + (long)plVar10);
                  auVar122 = *(undefined1 (*) [16])(lVar11 + 0x30 + (long)plVar10);
                }
                uVar45 = in_XMM14._0_4_;
                uVar75 = in_XMM14._4_4_;
                uVar76 = in_XMM14._8_4_;
                uVar78 = in_XMM14._12_4_;
                auVar164._4_4_ = uVar45;
                auVar164._0_4_ = uVar45;
                auVar164._8_4_ = uVar45;
                auVar164._12_4_ = uVar45;
                _local_a8 = blendvps(_local_a8,auVar164,auVar29);
                auVar165._4_4_ = uVar75;
                auVar165._0_4_ = uVar75;
                auVar165._8_4_ = uVar75;
                auVar165._12_4_ = uVar75;
                _local_98 = blendvps(_local_98,auVar165,auVar29);
                auVar166._4_4_ = uVar76;
                auVar166._0_4_ = uVar76;
                auVar166._8_4_ = uVar76;
                auVar166._12_4_ = uVar76;
                _local_88 = blendvps(_local_88,auVar166,auVar29);
                auVar167._4_4_ = uVar78;
                auVar167._0_4_ = uVar78;
                auVar167._8_4_ = uVar78;
                auVar167._12_4_ = uVar78;
                _local_188 = blendvps(_local_188,auVar167,auVar29);
                uVar45 = auVar214._0_4_;
                uVar75 = auVar214._4_4_;
                uVar76 = auVar214._8_4_;
                uVar78 = auVar214._12_4_;
                auVar168._4_4_ = uVar45;
                auVar168._0_4_ = uVar45;
                auVar168._8_4_ = uVar45;
                auVar168._12_4_ = uVar45;
                _local_78 = blendvps(_local_78,auVar168,auVar29);
                auVar169._4_4_ = uVar75;
                auVar169._0_4_ = uVar75;
                auVar169._8_4_ = uVar75;
                auVar169._12_4_ = uVar75;
                _local_68 = blendvps(_local_68,auVar169,auVar29);
                auVar170._4_4_ = uVar76;
                auVar170._0_4_ = uVar76;
                auVar170._8_4_ = uVar76;
                auVar170._12_4_ = uVar76;
                _local_e8 = blendvps(_local_e8,auVar170,auVar29);
                auVar171._4_4_ = uVar78;
                auVar171._0_4_ = uVar78;
                auVar171._8_4_ = uVar78;
                auVar171._12_4_ = uVar78;
                _local_178 = blendvps(_local_178,auVar171,auVar29);
                uVar45 = auVar254._0_4_;
                uVar75 = auVar254._4_4_;
                uVar76 = auVar254._8_4_;
                uVar78 = auVar254._12_4_;
                auVar172._4_4_ = uVar45;
                auVar172._0_4_ = uVar45;
                auVar172._8_4_ = uVar45;
                auVar172._12_4_ = uVar45;
                _local_168 = blendvps(_local_168,auVar172,auVar29);
                auVar173._4_4_ = uVar75;
                auVar173._0_4_ = uVar75;
                auVar173._8_4_ = uVar75;
                auVar173._12_4_ = uVar75;
                _local_158 = blendvps(_local_158,auVar173,auVar29);
                auVar174._4_4_ = uVar76;
                auVar174._0_4_ = uVar76;
                auVar174._8_4_ = uVar76;
                auVar174._12_4_ = uVar76;
                _local_d8 = blendvps(_local_d8,auVar174,auVar29);
                auVar175._4_4_ = uVar78;
                auVar175._0_4_ = uVar78;
                auVar175._8_4_ = uVar78;
                auVar175._12_4_ = uVar78;
                _local_258 = blendvps(_local_258,auVar175,auVar29);
                uVar45 = auVar122._0_4_;
                uVar75 = auVar122._4_4_;
                uVar76 = auVar122._8_4_;
                uVar78 = auVar122._12_4_;
                auVar176._4_4_ = uVar45;
                auVar176._0_4_ = uVar45;
                auVar176._8_4_ = uVar45;
                auVar176._12_4_ = uVar45;
                _local_c8 = blendvps(_local_c8,auVar176,auVar29);
                auVar177._4_4_ = uVar75;
                auVar177._0_4_ = uVar75;
                auVar177._8_4_ = uVar75;
                auVar177._12_4_ = uVar75;
                _local_138 = blendvps(_local_138,auVar177,auVar29);
                auVar178._4_4_ = uVar76;
                auVar178._0_4_ = uVar76;
                auVar178._8_4_ = uVar76;
                auVar178._12_4_ = uVar76;
                _local_118 = blendvps(_local_118,auVar178,auVar29);
                auVar179._4_4_ = uVar78;
                auVar179._0_4_ = uVar78;
                auVar179._8_4_ = uVar78;
                auVar179._12_4_ = uVar78;
                local_f8 = blendvps(local_f8,auVar179,auVar29);
                uVar9 = movmskps((int)plVar10,_local_288);
              } while (uVar9 != 0);
            }
            auVar108._0_4_ =
                 local_258._0_4_ * (float)local_208._0_4_ +
                 local_178._0_4_ * (float)local_218._0_4_ +
                 local_188._0_4_ * (float)local_1f8._0_4_ + local_f8._0_4_ * (float)local_148._0_4_;
            auVar108._4_4_ =
                 local_258._4_4_ * (float)local_208._4_4_ +
                 local_178._4_4_ * (float)local_218._4_4_ +
                 local_188._4_4_ * (float)local_1f8._4_4_ + local_f8._4_4_ * (float)local_148._4_4_;
            auVar108._8_4_ =
                 local_258._8_4_ * fStack_200 +
                 local_178._8_4_ * fStack_210 +
                 local_188._8_4_ * fStack_1f0 + local_f8._8_4_ * fStack_140;
            auVar108._12_4_ =
                 local_258._12_4_ * fStack_1fc +
                 local_178._12_4_ * fStack_20c +
                 local_188._12_4_ * fStack_1ec + local_f8._12_4_ * fStack_13c;
            uVar15 = CONCAT44(auVar108._4_4_,auVar108._0_4_);
            auVar230._0_8_ = uVar15 ^ 0x8000000080000000;
            auVar230._8_4_ = -auVar108._8_4_;
            auVar230._12_4_ = -auVar108._12_4_;
            auVar30._4_4_ = -(uint)(auVar108._4_4_ < -auVar108._4_4_);
            auVar30._0_4_ = -(uint)(auVar108._0_4_ < -auVar108._0_4_);
            auVar30._8_4_ = -(uint)(auVar108._8_4_ < auVar230._8_4_);
            auVar30._12_4_ = -(uint)(auVar108._12_4_ < auVar230._12_4_);
            auVar92._0_8_ = local_f8._0_8_ ^ 0x8000000080000000;
            auVar92._8_4_ = -local_f8._8_4_;
            auVar92._12_4_ = -local_f8._12_4_;
            auVar316 = blendvps(local_f8,auVar92,auVar30);
            auVar93._0_8_ = local_188 ^ 0x8000000080000000;
            auVar93._8_4_ = -local_188._8_4_;
            auVar93._12_4_ = -local_188._12_4_;
            auVar214 = blendvps(_local_188,auVar93,auVar30);
            auVar94._0_8_ = local_178 ^ 0x8000000080000000;
            auVar94._8_4_ = -local_178._8_4_;
            auVar94._12_4_ = -local_178._12_4_;
            auVar299 = blendvps(_local_178,auVar94,auVar30);
            auVar95._0_8_ = local_258 ^ 0x8000000080000000;
            auVar95._8_4_ = -local_258._8_4_;
            auVar95._12_4_ = -local_258._12_4_;
            auVar261 = blendvps(_local_258,auVar95,auVar30);
            auVar254 = maxps(auVar230,auVar108);
            fVar259 = ABS(auVar108._0_4_);
            fVar275 = ABS(auVar108._4_4_);
            uVar15 = CONCAT44(auVar108._4_4_,auVar108._0_4_);
            auVar109._0_8_ = uVar15 & 0x7fffffff7fffffff;
            auVar109._8_4_ = ABS(auVar108._8_4_);
            auVar109._12_4_ = ABS(auVar108._12_4_);
            auVar96._0_4_ = 1.0 - fVar259;
            auVar96._4_4_ = 1.0 - fVar275;
            auVar96._8_4_ = 1.0 - auVar109._8_4_;
            auVar96._12_4_ = 1.0 - auVar109._12_4_;
            auVar122 = sqrtps(auVar96,auVar96);
            auVar31._0_4_ =
                 1.5707964 -
                 auVar122._0_4_ *
                 (((((fVar259 * -0.0043095737 + 0.0192803) * fVar259 + -0.04489909) * fVar259 +
                   0.08785567) * fVar259 + -0.21450998) * fVar259 + 1.5707952);
            auVar31._4_4_ =
                 1.5707964 -
                 auVar122._4_4_ *
                 (((((fVar275 * -0.0043095737 + 0.0192803) * fVar275 + -0.04489909) * fVar275 +
                   0.08785567) * fVar275 + -0.21450998) * fVar275 + 1.5707952);
            auVar31._8_4_ =
                 1.5707964 -
                 auVar122._8_4_ *
                 (((((auVar109._8_4_ * -0.0043095737 + 0.0192803) * auVar109._8_4_ + -0.04489909) *
                    auVar109._8_4_ + 0.08785567) * auVar109._8_4_ + -0.21450998) * auVar109._8_4_ +
                 1.5707952);
            auVar31._12_4_ =
                 1.5707964 -
                 auVar122._12_4_ *
                 (((((auVar109._12_4_ * -0.0043095737 + 0.0192803) * auVar109._12_4_ + -0.04489909)
                    * auVar109._12_4_ + 0.08785567) * auVar109._12_4_ + -0.21450998) *
                  auVar109._12_4_ + 1.5707952);
            auVar122 = maxps(ZEXT816(0),auVar31);
            fVar195 = auVar254._0_4_;
            fVar196 = auVar254._4_4_;
            fVar209 = auVar254._8_4_;
            fVar210 = auVar254._12_4_;
            auVar32._4_4_ = -(uint)(fVar196 < 0.0);
            auVar32._0_4_ = -(uint)(fVar195 < 0.0);
            auVar32._8_4_ = -(uint)(fVar209 < 0.0);
            auVar32._12_4_ = -(uint)(fVar210 < 0.0);
            auVar97._0_8_ = auVar122._0_8_ ^ 0x8000000080000000;
            auVar97._8_4_ = auVar122._8_4_ ^ 0x80000000;
            auVar97._12_4_ = auVar122._12_4_ ^ 0x80000000;
            auVar122 = blendvps(auVar122,auVar97,auVar32);
            auVar98._0_4_ = 1.5707964 - auVar122._0_4_;
            auVar98._4_4_ = 1.5707964 - auVar122._4_4_;
            auVar98._8_4_ = 1.5707964 - auVar122._8_4_;
            auVar98._12_4_ = 1.5707964 - auVar122._12_4_;
            auVar33._4_4_ = -(uint)(1.0 < fVar275);
            auVar33._0_4_ = -(uint)(1.0 < fVar259);
            auVar33._8_4_ = -(uint)(1.0 < auVar109._8_4_);
            auVar33._12_4_ = -(uint)(1.0 < auVar109._12_4_);
            auVar122 = blendvps(auVar98,_DAT_01ff1c40,auVar33);
            fVar259 = auVar122._0_4_ * auVar265._0_4_;
            fVar275 = auVar122._4_4_ * auVar265._4_4_;
            fVar277 = auVar122._8_4_ * auVar265._8_4_;
            fVar279 = auVar122._12_4_ * auVar265._12_4_;
            auVar34._0_4_ = fVar259 * 0.63661975;
            auVar34._4_4_ = fVar275 * 0.63661975;
            auVar34._8_4_ = fVar277 * 0.63661975;
            auVar34._12_4_ = fVar279 * 0.63661975;
            auVar122 = roundps(auVar109,auVar34,1);
            uVar14 = (uint)auVar122._0_4_;
            uVar9 = (uint)auVar122._4_4_;
            uVar39 = (uint)auVar122._8_4_;
            uVar43 = (uint)auVar122._12_4_;
            fVar259 = fVar259 - auVar122._0_4_ * 1.5707964;
            fVar275 = fVar275 - auVar122._4_4_ * 1.5707964;
            fVar277 = fVar277 - auVar122._8_4_ * 1.5707964;
            fVar279 = fVar279 - auVar122._12_4_ * 1.5707964;
            uVar38 = uVar14 & 3;
            uVar42 = uVar9 & 3;
            uVar40 = uVar39 & 3;
            uVar44 = uVar43 & 3;
            fVar100 = fVar259 * fVar259;
            fVar101 = fVar275 * fVar275;
            fVar112 = fVar277 * fVar277;
            fVar77 = fVar279 * fVar279;
            uVar14 = uVar14 & 1;
            uVar9 = uVar9 & 1;
            uVar39 = uVar39 & 1;
            uVar43 = uVar43 & 1;
            auVar207._0_4_ = -(uint)(uVar14 == 0);
            auVar207._4_4_ = -(uint)(uVar9 == 0);
            auVar207._8_4_ = -(uint)(uVar39 == 0);
            auVar207._12_4_ = -(uint)(uVar43 == 0);
            auVar189._4_4_ = -uVar9;
            auVar189._0_4_ = -uVar14;
            auVar189._8_4_ = -uVar39;
            auVar189._12_4_ = -uVar43;
            auVar273._0_8_ =
                 CONCAT44((((((fVar101 * -2.5029328e-08 + 2.7600126e-06) * fVar101 + -0.00019842605)
                             * fVar101 + 0.008333348) * fVar101 + -0.16666667) * fVar101 + 1.0) *
                          fVar275,(((((fVar100 * -2.5029328e-08 + 2.7600126e-06) * fVar100 +
                                     -0.00019842605) * fVar100 + 0.008333348) * fVar100 +
                                   -0.16666667) * fVar100 + 1.0) * fVar259);
            auVar273._8_4_ =
                 (((((fVar112 * -2.5029328e-08 + 2.7600126e-06) * fVar112 + -0.00019842605) *
                    fVar112 + 0.008333348) * fVar112 + -0.16666667) * fVar112 + 1.0) * fVar277;
            auVar273._12_4_ =
                 (((((fVar77 * -2.5029328e-08 + 2.7600126e-06) * fVar77 + -0.00019842605) * fVar77 +
                   0.008333348) * fVar77 + -0.16666667) * fVar77 + 1.0) * fVar279;
            auVar131._0_4_ =
                 ((((fVar100 * -2.5963018e-07 + 2.4756235e-05) * fVar100 + -0.001388833) * fVar100 +
                  0.04166664) * fVar100 + -0.5) * fVar100 + 1.0;
            auVar131._4_4_ =
                 ((((fVar101 * -2.5963018e-07 + 2.4756235e-05) * fVar101 + -0.001388833) * fVar101 +
                  0.04166664) * fVar101 + -0.5) * fVar101 + 1.0;
            auVar131._8_4_ =
                 ((((fVar112 * -2.5963018e-07 + 2.4756235e-05) * fVar112 + -0.001388833) * fVar112 +
                  0.04166664) * fVar112 + -0.5) * fVar112 + 1.0;
            auVar131._12_4_ =
                 ((((fVar77 * -2.5963018e-07 + 2.4756235e-05) * fVar77 + -0.001388833) * fVar77 +
                  0.04166664) * fVar77 + -0.5) * fVar77 + 1.0;
            auVar291._8_4_ = auVar273._8_4_;
            auVar291._0_8_ = auVar273._0_8_;
            auVar291._12_4_ = auVar273._12_4_;
            auVar254 = blendvps(auVar291,auVar131,auVar189);
            auVar122 = blendvps(auVar273,auVar131,auVar207);
            auVar35._0_4_ = -(uint)(1 < uVar38);
            auVar35._4_4_ = -(uint)(1 < uVar42);
            auVar35._8_4_ = -(uint)(1 < uVar40);
            auVar35._12_4_ = -(uint)(1 < uVar44);
            auVar132._0_8_ = auVar254._0_8_ ^ 0x8000000080000000;
            auVar132._8_4_ = auVar254._8_4_ ^ 0x80000000;
            auVar132._12_4_ = auVar254._12_4_ ^ 0x80000000;
            auVar282 = blendvps(auVar254,auVar132,auVar35);
            uVar38 = uVar38 - 1;
            uVar42 = uVar42 - 1;
            uVar40 = uVar40 - 1;
            uVar44 = uVar44 - 1;
            auVar221._0_4_ = -(uint)(((uVar38 == 0) * uVar38 | (uint)(uVar38 != 0)) == uVar38);
            auVar221._4_4_ = -(uint)(((uVar42 == 0) * uVar42 | (uint)(uVar42 != 0)) == uVar42);
            auVar221._8_4_ = -(uint)(((uVar40 == 0) * uVar40 | (uint)(uVar40 != 0)) == uVar40);
            auVar221._12_4_ = -(uint)(((uVar44 == 0) * uVar44 | (uint)(uVar44 != 0)) == uVar44);
            auVar72._0_8_ = auVar122._0_8_ ^ 0x8000000080000000;
            auVar72._8_4_ = auVar122._8_4_ ^ 0x80000000;
            auVar72._12_4_ = auVar122._12_4_ ^ 0x80000000;
            auVar254 = blendvps(auVar122,auVar72,auVar221);
            fVar275 = (float)local_148._0_4_ * fVar195 - auVar316._0_4_;
            fVar279 = (float)local_148._4_4_ * fVar196 - auVar316._4_4_;
            fVar101 = fStack_140 * fVar209 - auVar316._8_4_;
            fVar77 = fStack_13c * fVar210 - auVar316._12_4_;
            local_188._0_4_ = auVar214._0_4_;
            local_188._4_4_ = auVar214._4_4_;
            fStack_180 = auVar214._8_4_;
            fStack_17c = auVar214._12_4_;
            fVar115 = (float)local_1f8._0_4_ * fVar195 - (float)local_188._0_4_;
            fVar116 = (float)local_1f8._4_4_ * fVar196 - (float)local_188._4_4_;
            fVar118 = fStack_1f0 * fVar209 - fStack_180;
            fVar119 = fStack_1ec * fVar210 - fStack_17c;
            fVar133 = (float)local_218._0_4_ * fVar195 - auVar299._0_4_;
            fVar134 = (float)local_218._4_4_ * fVar196 - auVar299._4_4_;
            fVar135 = fStack_210 * fVar209 - auVar299._8_4_;
            fVar136 = fStack_20c * fVar210 - auVar299._12_4_;
            local_258._0_4_ = auVar261._0_4_;
            local_258._4_4_ = auVar261._4_4_;
            fStack_250 = auVar261._8_4_;
            fStack_24c = auVar261._12_4_;
            fVar259 = (float)local_208._0_4_ * fVar195 - (float)local_258._0_4_;
            fVar277 = (float)local_208._4_4_ * fVar196 - (float)local_258._4_4_;
            fVar100 = fStack_200 * fVar209 - fStack_250;
            fVar112 = fStack_1fc * fVar210 - fStack_24c;
            auVar73._0_4_ =
                 fVar259 * fVar259 + fVar133 * fVar133 + fVar115 * fVar115 + fVar275 * fVar275;
            auVar73._4_4_ =
                 fVar277 * fVar277 + fVar134 * fVar134 + fVar116 * fVar116 + fVar279 * fVar279;
            auVar73._8_4_ =
                 fVar100 * fVar100 + fVar135 * fVar135 + fVar118 * fVar118 + fVar101 * fVar101;
            auVar73._12_4_ =
                 fVar112 * fVar112 + fVar136 * fVar136 + fVar119 * fVar119 + fVar77 * fVar77;
            auVar122 = rsqrtps(auVar189,auVar73);
            fVar184 = auVar122._0_4_;
            fVar246 = auVar122._4_4_;
            fVar182 = auVar122._8_4_;
            fVar192 = auVar122._12_4_;
            fVar181 = fVar184 * 1.5 - fVar184 * fVar184 * auVar73._0_4_ * 0.5 * fVar184;
            fVar183 = fVar246 * 1.5 - fVar246 * fVar246 * auVar73._4_4_ * 0.5 * fVar246;
            fVar191 = fVar182 * 1.5 - fVar182 * fVar182 * auVar73._8_4_ * 0.5 * fVar182;
            fVar193 = fVar192 * 1.5 - fVar192 * fVar192 * auVar73._12_4_ * 0.5 * fVar192;
            fVar233 = auVar282._0_4_;
            fVar234 = auVar282._4_4_;
            fVar235 = auVar282._8_4_;
            fVar236 = auVar282._12_4_;
            fVar211 = auVar254._0_4_;
            fVar222 = auVar254._4_4_;
            fVar223 = auVar254._8_4_;
            fVar232 = auVar254._12_4_;
            auVar306._0_4_ = (float)local_148._0_4_ * fVar211 - fVar275 * fVar181 * fVar233;
            auVar306._4_4_ = (float)local_148._4_4_ * fVar222 - fVar279 * fVar183 * fVar234;
            auVar306._8_4_ = fStack_140 * fVar223 - fVar101 * fVar191 * fVar235;
            auVar306._12_4_ = fStack_13c * fVar232 - fVar77 * fVar193 * fVar236;
            fVar237 = (auVar316._0_4_ - (float)local_148._0_4_) * auVar265._0_4_ +
                      (float)local_148._0_4_;
            fVar238 = (auVar316._4_4_ - (float)local_148._4_4_) * auVar265._4_4_ +
                      (float)local_148._4_4_;
            fStack_140 = (auVar316._8_4_ - fStack_140) * auVar265._8_4_ + fStack_140;
            fStack_13c = (auVar316._12_4_ - fStack_13c) * auVar265._12_4_ + fStack_13c;
            fVar184 = ((float)local_188._0_4_ - (float)local_1f8._0_4_) * auVar265._0_4_ +
                      (float)local_1f8._0_4_;
            fVar246 = ((float)local_188._4_4_ - (float)local_1f8._4_4_) * auVar265._4_4_ +
                      (float)local_1f8._4_4_;
            fVar182 = (fStack_180 - fStack_1f0) * auVar265._8_4_ + fStack_1f0;
            fVar192 = (fStack_17c - fStack_1ec) * auVar265._12_4_ + fStack_1ec;
            fVar138 = (auVar299._0_4_ - (float)local_218._0_4_) * auVar265._0_4_ +
                      (float)local_218._0_4_;
            fVar139 = (auVar299._4_4_ - (float)local_218._4_4_) * auVar265._4_4_ +
                      (float)local_218._4_4_;
            fVar141 = (auVar299._8_4_ - fStack_210) * auVar265._8_4_ + fStack_210;
            fVar180 = (auVar299._12_4_ - fStack_20c) * auVar265._12_4_ + fStack_20c;
            auVar110._0_4_ = fVar138 * fVar138 + fVar184 * fVar184 + fVar237 * fVar237;
            auVar110._4_4_ = fVar139 * fVar139 + fVar246 * fVar246 + fVar238 * fVar238;
            auVar110._8_4_ = fVar141 * fVar141 + fVar182 * fVar182 + fStack_140 * fStack_140;
            auVar110._12_4_ = fVar180 * fVar180 + fVar192 * fVar192 + fStack_13c * fStack_13c;
            fVar275 = ((float)local_258._0_4_ - (float)local_208._0_4_) * auVar265._0_4_ +
                      (float)local_208._0_4_;
            fVar279 = ((float)local_258._4_4_ - (float)local_208._4_4_) * auVar265._4_4_ +
                      (float)local_208._4_4_;
            fVar101 = (fStack_250 - fStack_200) * auVar265._8_4_ + fStack_200;
            fVar77 = (fStack_24c - fStack_1fc) * auVar265._12_4_ + fStack_1fc;
            auVar74._0_4_ = fVar275 * fVar275 + auVar110._0_4_;
            auVar74._4_4_ = fVar279 * fVar279 + auVar110._4_4_;
            auVar74._8_4_ = fVar101 * fVar101 + auVar110._8_4_;
            auVar74._12_4_ = fVar77 * fVar77 + auVar110._12_4_;
            auVar122 = rsqrtps(auVar110,auVar74);
            fVar194 = auVar122._0_4_;
            fVar113 = auVar122._4_4_;
            fVar117 = auVar122._8_4_;
            fVar114 = auVar122._12_4_;
            fVar194 = fVar194 * 1.5 - fVar194 * fVar194 * auVar74._0_4_ * 0.5 * fVar194;
            fVar113 = fVar113 * 1.5 - fVar113 * fVar113 * auVar74._4_4_ * 0.5 * fVar113;
            fVar117 = fVar117 * 1.5 - fVar117 * fVar117 * auVar74._8_4_ * 0.5 * fVar117;
            fVar114 = fVar114 * 1.5 - fVar114 * fVar114 * auVar74._12_4_ * 0.5 * fVar114;
            auVar320._0_4_ = fVar237 * fVar194;
            auVar320._4_4_ = fVar238 * fVar113;
            auVar320._8_4_ = fStack_140 * fVar117;
            auVar320._12_4_ = fStack_13c * fVar114;
            auVar36._4_4_ = -(uint)(0.9995 < fVar196);
            auVar36._0_4_ = -(uint)(0.9995 < fVar195);
            auVar36._8_4_ = -(uint)(0.9995 < fVar209);
            auVar36._12_4_ = -(uint)(0.9995 < fVar210);
            auVar254 = blendvps(auVar306,auVar320,auVar36);
            auVar111._0_4_ = (float)local_1f8._0_4_ * fVar211 - fVar115 * fVar181 * fVar233;
            auVar111._4_4_ = (float)local_1f8._4_4_ * fVar222 - fVar116 * fVar183 * fVar234;
            auVar111._8_4_ = fStack_1f0 * fVar223 - fVar118 * fVar191 * fVar235;
            auVar111._12_4_ = fStack_1ec * fVar232 - fVar119 * fVar193 * fVar236;
            auVar99._0_4_ = fVar184 * fVar194;
            auVar99._4_4_ = fVar246 * fVar113;
            auVar99._8_4_ = fVar182 * fVar117;
            auVar99._12_4_ = fVar192 * fVar114;
            auVar122 = blendvps(auVar111,auVar99,auVar36);
            auVar190._0_4_ = (float)local_218._0_4_ * fVar211 - fVar133 * fVar181 * fVar233;
            auVar190._4_4_ = (float)local_218._4_4_ * fVar222 - fVar134 * fVar183 * fVar234;
            auVar190._8_4_ = fStack_210 * fVar223 - fVar135 * fVar191 * fVar235;
            auVar190._12_4_ = fStack_20c * fVar232 - fVar136 * fVar193 * fVar236;
            auVar208._0_4_ = fVar138 * fVar194;
            auVar208._4_4_ = fVar139 * fVar113;
            auVar208._8_4_ = fVar141 * fVar117;
            auVar208._12_4_ = fVar180 * fVar114;
            auVar261 = blendvps(auVar190,auVar208,auVar36);
            auVar274._0_4_ = fVar211 * (float)local_208._0_4_ - fVar181 * fVar259 * fVar233;
            auVar274._4_4_ = fVar222 * (float)local_208._4_4_ - fVar183 * fVar277 * fVar234;
            auVar274._8_4_ = fVar223 * fStack_200 - fVar191 * fVar100 * fVar235;
            auVar274._12_4_ = fVar232 * fStack_1fc - fVar193 * fVar112 * fVar236;
            auVar231._0_4_ = fVar194 * fVar275;
            auVar231._4_4_ = fVar113 * fVar279;
            auVar231._8_4_ = fVar117 * fVar101;
            auVar231._12_4_ = fVar114 * fVar77;
            auVar214 = blendvps(auVar274,auVar231,auVar36);
            fVar100 = 1.0 - auVar265._0_4_;
            fVar101 = 1.0 - auVar265._4_4_;
            fVar112 = 1.0 - auVar265._8_4_;
            fVar77 = 1.0 - auVar265._12_4_;
            fVar259 = (float)local_1c8._0_4_ * fVar100 + (float)local_a8._0_4_ * auVar265._0_4_;
            fVar275 = (float)local_1c8._4_4_ * fVar101 + (float)local_a8._4_4_ * auVar265._4_4_;
            fVar277 = (float)uStack_1c0 * fVar112 + fStack_a0 * auVar265._8_4_;
            fVar279 = uStack_1c0._4_4_ * fVar77 + fStack_9c * auVar265._12_4_;
            local_248._4_4_ =
                 (float)local_248._4_4_ * fVar101 + (float)local_98._4_4_ * auVar265._4_4_;
            local_248._0_4_ =
                 (float)local_248._0_4_ * fVar100 + (float)local_98._0_4_ * auVar265._0_4_;
            uStack_240._0_4_ = (float)uStack_240 * fVar112 + fStack_90 * auVar265._8_4_;
            uStack_240._4_4_ = uStack_240._4_4_ * fVar77 + fStack_8c * auVar265._12_4_;
            local_228._4_4_ =
                 (float)local_228._4_4_ * fVar101 + (float)local_88._4_4_ * auVar265._4_4_;
            local_228._0_4_ =
                 (float)local_228._0_4_ * fVar100 + (float)local_88._0_4_ * auVar265._0_4_;
            uStack_220._0_4_ = (float)uStack_220 * fVar112 + fStack_80 * auVar265._8_4_;
            uStack_220._4_4_ = uStack_220._4_4_ * fVar77 + fStack_7c * auVar265._12_4_;
            local_278._4_4_ =
                 (float)local_278._4_4_ * fVar101 + (float)local_78._4_4_ * auVar265._4_4_;
            local_278._0_4_ =
                 (float)local_278._0_4_ * fVar100 + (float)local_78._0_4_ * auVar265._0_4_;
            fStack_270 = fStack_270 * fVar112 + fStack_70 * auVar265._8_4_;
            fStack_26c = fStack_26c * fVar77 + fStack_6c * auVar265._12_4_;
            local_1d8._4_4_ =
                 (float)local_1d8._4_4_ * fVar101 + (float)local_68._4_4_ * auVar265._4_4_;
            local_1d8._0_4_ =
                 (float)local_1d8._0_4_ * fVar100 + (float)local_68._0_4_ * auVar265._0_4_;
            fStack_1d0 = fStack_1d0 * fVar112 + fStack_60 * auVar265._8_4_;
            fStack_1cc = fStack_1cc * fVar77 + fStack_5c * auVar265._12_4_;
            local_238._4_4_ =
                 (float)local_238._4_4_ * fVar101 + (float)local_e8._4_4_ * auVar265._4_4_;
            local_238._0_4_ =
                 (float)local_238._0_4_ * fVar100 + (float)local_e8._0_4_ * auVar265._0_4_;
            uStack_230._0_4_ = (float)uStack_230 * fVar112 + fStack_e0 * auVar265._8_4_;
            uStack_230._4_4_ = uStack_230._4_4_ * fVar77 + fStack_dc * auVar265._12_4_;
            local_268._4_4_ =
                 (float)local_268._4_4_ * fVar101 + (float)local_168._4_4_ * auVar265._4_4_;
            local_268._0_4_ =
                 (float)local_268._0_4_ * fVar100 + (float)local_168._0_4_ * auVar265._0_4_;
            fStack_260 = fStack_260 * fVar112 + fStack_160 * auVar265._8_4_;
            fStack_25c = fStack_25c * fVar77 + fStack_15c * auVar265._12_4_;
            local_1a8._4_4_ =
                 (float)local_1a8._4_4_ * fVar101 + (float)local_158._4_4_ * auVar265._4_4_;
            local_1a8._0_4_ =
                 (float)local_1a8._0_4_ * fVar100 + (float)local_158._0_4_ * auVar265._0_4_;
            fStack_1a0 = fStack_1a0 * fVar112 + fStack_150 * auVar265._8_4_;
            fStack_19c = fStack_19c * fVar77 + fStack_14c * auVar265._12_4_;
            local_1b8._4_4_ =
                 (float)local_1b8._4_4_ * fVar101 + (float)local_d8._4_4_ * auVar265._4_4_;
            local_1b8._0_4_ =
                 (float)local_1b8._0_4_ * fVar100 + (float)local_d8._0_4_ * auVar265._0_4_;
            fStack_1b0 = fStack_1b0 * fVar112 + fStack_d0 * auVar265._8_4_;
            fStack_1ac = fStack_1ac * fVar77 + fStack_cc * auVar265._12_4_;
            local_1e8._4_4_ =
                 (float)local_1e8._4_4_ * fVar101 + (float)local_c8._4_4_ * auVar265._4_4_;
            local_1e8._0_4_ =
                 (float)local_1e8._0_4_ * fVar100 + (float)local_c8._0_4_ * auVar265._0_4_;
            uStack_1e0._0_4_ = (float)uStack_1e0 * fVar112 + fStack_c0 * auVar265._8_4_;
            uStack_1e0._4_4_ = uStack_1e0._4_4_ * fVar77 + fStack_bc * auVar265._12_4_;
            local_198._4_4_ =
                 (float)local_198._4_4_ * fVar101 + (float)local_138._4_4_ * auVar265._4_4_;
            local_198._0_4_ =
                 (float)local_198._0_4_ * fVar100 + (float)local_138._0_4_ * auVar265._0_4_;
            fStack_190 = fStack_190 * fVar112 + fStack_130 * auVar265._8_4_;
            fStack_18c = fStack_18c * fVar77 + fStack_12c * auVar265._12_4_;
            local_1f8._4_4_ =
                 fVar101 * (float)local_128._4_4_ + (float)local_118._4_4_ * auVar265._4_4_;
            local_1f8._0_4_ =
                 fVar100 * (float)local_128._0_4_ + (float)local_118._0_4_ * auVar265._0_4_;
            fStack_1f0 = fVar112 * fStack_120 + fStack_110 * auVar265._8_4_;
            fStack_1ec = fVar77 * fStack_11c + fStack_10c * auVar265._12_4_;
            fVar115 = auVar122._0_4_;
            fVar116 = auVar122._4_4_;
            fVar119 = auVar122._12_4_;
            fVar233 = auVar254._0_4_;
            fVar234 = auVar254._4_4_;
            fVar235 = auVar254._8_4_;
            fVar236 = auVar254._12_4_;
            fVar118 = auVar122._8_4_;
            fVar134 = auVar261._0_4_;
            fVar136 = auVar261._4_4_;
            fVar139 = auVar261._8_4_;
            fVar180 = auVar261._12_4_;
            fVar184 = auVar214._0_4_;
            fVar182 = auVar214._4_4_;
            fVar194 = auVar214._8_4_;
            fVar117 = auVar214._12_4_;
            fVar100 = fVar115 * fVar134 + fVar233 * fVar184;
            fVar101 = fVar116 * fVar136 + fVar234 * fVar182;
            fVar112 = fVar118 * fVar139 + fVar235 * fVar194;
            fVar77 = fVar119 * fVar180 + fVar236 * fVar117;
            fVar237 = fVar115 * fVar134 - fVar233 * fVar184;
            fVar238 = fVar116 * fVar136 - fVar234 * fVar182;
            fVar245 = fVar118 * fVar139 - fVar235 * fVar194;
            fVar247 = fVar119 * fVar180 - fVar236 * fVar117;
            fVar211 = fVar134 * fVar134;
            fVar222 = fVar136 * fVar136;
            fVar223 = fVar139 * fVar139;
            fVar232 = fVar180 * fVar180;
            fVar246 = fVar233 * fVar233 - fVar115 * fVar115;
            fVar192 = fVar234 * fVar234 - fVar116 * fVar116;
            fVar113 = fVar235 * fVar235 - fVar118 * fVar118;
            fVar114 = fVar236 * fVar236 - fVar119 * fVar119;
            fVar133 = fVar115 * fVar184 - fVar233 * fVar134;
            fVar135 = fVar116 * fVar182 - fVar234 * fVar136;
            fVar138 = fVar118 * fVar194 - fVar235 * fVar139;
            fVar141 = fVar119 * fVar117 - fVar236 * fVar180;
            fVar181 = fVar233 * fVar134 + fVar115 * fVar184;
            fVar183 = fVar234 * fVar136 + fVar116 * fVar182;
            fVar191 = fVar235 * fVar139 + fVar118 * fVar194;
            fVar193 = fVar236 * fVar180 + fVar119 * fVar117;
            fVar195 = fVar184 * fVar134 + fVar115 * fVar233;
            fVar196 = fVar182 * fVar136 + fVar116 * fVar234;
            fVar209 = fVar194 * fVar139 + fVar118 * fVar235;
            fVar210 = fVar117 * fVar180 + fVar119 * fVar236;
            fVar134 = fVar184 * fVar134 - fVar115 * fVar233;
            fVar136 = fVar182 * fVar136 - fVar116 * fVar234;
            fVar139 = fVar194 * fVar139 - fVar118 * fVar235;
            fVar180 = fVar117 * fVar180 - fVar119 * fVar236;
            fVar184 = fVar184 * fVar184;
            fVar182 = fVar182 * fVar182;
            fVar194 = fVar194 * fVar194;
            fVar117 = fVar117 * fVar117;
            fVar233 = ((fVar233 * fVar233 + fVar115 * fVar115) - fVar211) - fVar184;
            fVar234 = ((fVar234 * fVar234 + fVar116 * fVar116) - fVar222) - fVar182;
            fVar235 = ((fVar235 * fVar235 + fVar118 * fVar118) - fVar223) - fVar194;
            fVar236 = ((fVar236 * fVar236 + fVar119 * fVar119) - fVar232) - fVar117;
            fVar115 = (fVar211 + fVar246) - fVar184;
            fVar116 = (fVar222 + fVar192) - fVar182;
            fVar118 = (fVar223 + fVar113) - fVar194;
            fVar119 = (fVar232 + fVar114) - fVar117;
            fVar184 = (fVar246 - fVar211) + fVar184;
            fVar182 = (fVar192 - fVar222) + fVar182;
            fVar194 = (fVar113 - fVar223) + fVar194;
            fVar117 = (fVar114 - fVar232) + fVar117;
          }
          fVar246 = (fVar133 + fVar133) * 0.0;
          fVar192 = (fVar135 + fVar135) * 0.0;
          fVar113 = (fVar138 + fVar138) * 0.0;
          fVar114 = (fVar141 + fVar141) * 0.0;
          fVar248 = (fVar100 + fVar100) * 0.0;
          fVar280 = (fVar101 + fVar101) * 0.0;
          fVar293 = (fVar112 + fVar112) * 0.0;
          fVar296 = (fVar77 + fVar77) * 0.0;
          fVar276 = fVar248 + fVar246 + fVar233;
          fVar292 = fVar280 + fVar192 + fVar234;
          fVar294 = fVar293 + fVar113 + fVar235;
          fVar307 = fVar296 + fVar114 + fVar236;
          fVar211 = fVar246 + fVar100 + fVar100 + fVar233 * 0.0;
          fVar222 = fVar192 + fVar101 + fVar101 + fVar234 * 0.0;
          fVar223 = fVar113 + fVar112 + fVar112 + fVar235 * 0.0;
          fVar232 = fVar114 + fVar77 + fVar77 + fVar236 * 0.0;
          fVar297 = fVar233 * 0.0 + fVar133 + fVar133 + fVar248;
          fVar308 = fVar234 * 0.0 + fVar135 + fVar135 + fVar280;
          fVar310 = fVar235 * 0.0 + fVar138 + fVar138 + fVar293;
          fVar312 = fVar236 * 0.0 + fVar141 + fVar141 + fVar296;
          fVar100 = (fVar195 + fVar195) * 0.0;
          fVar101 = (fVar196 + fVar196) * 0.0;
          fVar112 = (fVar209 + fVar209) * 0.0;
          fVar77 = (fVar210 + fVar210) * 0.0;
          fVar248 = fVar100 + fVar115 * 0.0 + fVar237 + fVar237;
          fVar280 = fVar101 + fVar116 * 0.0 + fVar238 + fVar238;
          fVar293 = fVar112 + fVar118 * 0.0 + fVar245 + fVar245;
          fVar296 = fVar77 + fVar119 * 0.0 + fVar247 + fVar247;
          fVar314 = (fVar237 + fVar237) * 0.0;
          fVar322 = (fVar238 + fVar238) * 0.0;
          fVar324 = (fVar245 + fVar245) * 0.0;
          fVar326 = (fVar247 + fVar247) * 0.0;
          fVar321 = fVar115 + fVar100 + fVar314;
          fVar323 = fVar116 + fVar101 + fVar322;
          fVar325 = fVar118 + fVar112 + fVar324;
          fVar295 = fVar119 + fVar77 + fVar326;
          fVar314 = fVar314 + fVar115 * 0.0 + fVar195 + fVar195;
          fVar322 = fVar322 + fVar116 * 0.0 + fVar196 + fVar196;
          fVar324 = fVar324 + fVar118 * 0.0 + fVar209 + fVar209;
          fVar326 = fVar326 + fVar119 * 0.0 + fVar210 + fVar210;
          fVar100 = (fVar134 + fVar134) * 0.0;
          fVar101 = (fVar136 + fVar136) * 0.0;
          fVar112 = (fVar139 + fVar139) * 0.0;
          fVar77 = (fVar180 + fVar180) * 0.0;
          fVar115 = fVar100 + fVar184 * 0.0 + fVar181 + fVar181;
          fVar116 = fVar101 + fVar182 * 0.0 + fVar183 + fVar183;
          fVar118 = fVar112 + fVar194 * 0.0 + fVar191 + fVar191;
          fVar119 = fVar77 + fVar117 * 0.0 + fVar193 + fVar193;
          fVar233 = (fVar181 + fVar181) * 0.0;
          fVar234 = (fVar183 + fVar183) * 0.0;
          fVar235 = (fVar191 + fVar191) * 0.0;
          fVar236 = (fVar193 + fVar193) * 0.0;
          fVar195 = fVar184 * 0.0 + fVar134 + fVar134 + fVar233;
          fVar196 = fVar182 * 0.0 + fVar136 + fVar136 + fVar234;
          fVar209 = fVar194 * 0.0 + fVar139 + fVar139 + fVar235;
          fVar210 = fVar117 * 0.0 + fVar180 + fVar180 + fVar236;
          fVar233 = fVar233 + fVar100 + fVar184;
          fVar234 = fVar234 + fVar101 + fVar182;
          fVar235 = fVar235 + fVar112 + fVar194;
          fVar236 = fVar236 + fVar77 + fVar117;
          fVar181 = fVar259 * fVar276 + fVar248 * 0.0 + fVar115 * 0.0;
          fVar183 = fVar275 * fVar292 + fVar280 * 0.0 + fVar116 * 0.0;
          fVar191 = fVar277 * fVar294 + fVar293 * 0.0 + fVar118 * 0.0;
          fVar193 = fVar279 * fVar307 + fVar296 * 0.0 + fVar119 * 0.0;
          fVar237 = fVar259 * fVar211 + fVar321 * 0.0 + fVar195 * 0.0;
          fVar238 = fVar275 * fVar222 + fVar323 * 0.0 + fVar196 * 0.0;
          fVar245 = fVar277 * fVar223 + fVar325 * 0.0 + fVar209 * 0.0;
          fVar247 = fVar279 * fVar232 + fVar295 * 0.0 + fVar210 * 0.0;
          fVar259 = fVar259 * fVar297 + fVar314 * 0.0 + fVar233 * 0.0;
          fVar100 = fVar275 * fVar308 + fVar322 * 0.0 + fVar234 * 0.0;
          fVar112 = fVar277 * fVar310 + fVar324 * 0.0 + fVar235 * 0.0;
          fVar246 = fVar279 * fVar312 + fVar326 * 0.0 + fVar236 * 0.0;
          fVar133 = (float)local_278._0_4_ * fVar276 +
                    (float)local_1d8._0_4_ * fVar248 + fVar115 * 0.0;
          fVar135 = (float)local_278._4_4_ * fVar292 +
                    (float)local_1d8._4_4_ * fVar280 + fVar116 * 0.0;
          fVar138 = fStack_270 * fVar294 + fStack_1d0 * fVar293 + fVar118 * 0.0;
          fVar141 = fStack_26c * fVar307 + fStack_1cc * fVar296 + fVar119 * 0.0;
          fVar309 = (float)local_278._0_4_ * fVar211 +
                    (float)local_1d8._0_4_ * fVar321 + fVar195 * 0.0;
          fVar311 = (float)local_278._4_4_ * fVar222 +
                    (float)local_1d8._4_4_ * fVar323 + fVar196 * 0.0;
          fVar278 = fStack_270 * fVar223 + fStack_1d0 * fVar325 + fVar209 * 0.0;
          fVar313 = fStack_26c * fVar232 + fStack_1cc * fVar295 + fVar210 * 0.0;
          fVar275 = (float)local_278._0_4_ * fVar297 +
                    (float)local_1d8._0_4_ * fVar314 + fVar233 * 0.0;
          fVar279 = (float)local_278._4_4_ * fVar308 +
                    (float)local_1d8._4_4_ * fVar322 + fVar234 * 0.0;
          fVar77 = fStack_270 * fVar310 + fStack_1d0 * fVar324 + fVar235 * 0.0;
          fVar182 = fStack_26c * fVar312 + fStack_1cc * fVar326 + fVar236 * 0.0;
          fVar134 = (float)local_268._0_4_ * fVar276 +
                    (float)local_1a8._0_4_ * fVar248 + (float)local_1b8._0_4_ * fVar115;
          fVar136 = (float)local_268._4_4_ * fVar292 +
                    (float)local_1a8._4_4_ * fVar280 + (float)local_1b8._4_4_ * fVar116;
          fVar139 = fStack_260 * fVar294 + fStack_1a0 * fVar293 + fStack_1b0 * fVar118;
          fVar180 = fStack_25c * fVar307 + fStack_19c * fVar296 + fStack_1ac * fVar119;
          fVar194 = (float)local_268._0_4_ * fVar211 +
                    (float)local_1a8._0_4_ * fVar321 + (float)local_1b8._0_4_ * fVar195;
          fVar113 = (float)local_268._4_4_ * fVar222 +
                    (float)local_1a8._4_4_ * fVar323 + (float)local_1b8._4_4_ * fVar196;
          fVar117 = fStack_260 * fVar223 + fStack_1a0 * fVar325 + fStack_1b0 * fVar209;
          fVar114 = fStack_25c * fVar232 + fStack_19c * fVar295 + fStack_1ac * fVar210;
          fVar277 = (float)local_268._0_4_ * fVar297 +
                    (float)local_1a8._0_4_ * fVar314 + (float)local_1b8._0_4_ * fVar233;
          fVar101 = (float)local_268._4_4_ * fVar308 +
                    (float)local_1a8._4_4_ * fVar322 + (float)local_1b8._4_4_ * fVar234;
          fVar184 = fStack_260 * fVar310 + fStack_1a0 * fVar324 + fStack_1b0 * fVar235;
          fVar192 = fStack_25c * fVar312 + fStack_19c * fVar326 + fStack_1ac * fVar236;
          fVar248 = fVar276 * (float)local_1e8._0_4_ +
                    fVar248 * (float)local_198._0_4_ + fVar115 * (float)local_1f8._0_4_ +
                    (float)local_248._0_4_ + 0.0;
          fVar276 = fVar292 * (float)local_1e8._4_4_ +
                    fVar280 * (float)local_198._4_4_ + fVar116 * (float)local_1f8._4_4_ +
                    (float)local_248._4_4_ + 0.0;
          fVar280 = fVar294 * (float)uStack_1e0 + fVar293 * fStack_190 + fVar118 * fStack_1f0 +
                    (float)uStack_240 + 0.0;
          fVar292 = fVar307 * uStack_1e0._4_4_ + fVar296 * fStack_18c + fVar119 * fStack_1ec +
                    uStack_240._4_4_ + 0.0;
          fVar195 = fVar211 * (float)local_1e8._0_4_ +
                    fVar321 * (float)local_198._0_4_ + fVar195 * (float)local_1f8._0_4_ +
                    (float)local_228._0_4_ + 0.0;
          fVar196 = fVar222 * (float)local_1e8._4_4_ +
                    fVar323 * (float)local_198._4_4_ + fVar196 * (float)local_1f8._4_4_ +
                    (float)local_228._4_4_ + 0.0;
          fVar209 = fVar223 * (float)uStack_1e0 + fVar325 * fStack_190 + fVar209 * fStack_1f0 +
                    (float)uStack_220 + 0.0;
          fVar210 = fVar232 * uStack_1e0._4_4_ + fVar295 * fStack_18c + fVar210 * fStack_1ec +
                    uStack_220._4_4_ + 0.0;
          fVar115 = fVar297 * (float)local_1e8._0_4_ +
                    fVar314 * (float)local_198._0_4_ + fVar233 * (float)local_1f8._0_4_ +
                    (float)local_238._0_4_ + 0.0;
          fVar116 = fVar308 * (float)local_1e8._4_4_ +
                    fVar322 * (float)local_198._4_4_ + fVar234 * (float)local_1f8._4_4_ +
                    (float)local_238._4_4_ + 0.0;
          fVar118 = fVar310 * (float)uStack_1e0 + fVar324 * fStack_190 + fVar235 * fStack_1f0 +
                    (float)uStack_230 + 0.0;
          fVar119 = fVar312 * uStack_1e0._4_4_ + fVar326 * fStack_18c + fVar236 * fStack_1ec +
                    uStack_230._4_4_ + 0.0;
          auVar288._0_4_ = fVar309 * fVar277 - fVar275 * fVar194;
          auVar288._4_4_ = fVar311 * fVar101 - fVar279 * fVar113;
          auVar288._8_4_ = fVar278 * fVar184 - fVar77 * fVar117;
          auVar288._12_4_ = fVar313 * fVar192 - fVar182 * fVar114;
          auVar219._0_4_ = fVar275 * fVar134 - fVar133 * fVar277;
          auVar219._4_4_ = fVar279 * fVar136 - fVar135 * fVar101;
          auVar219._8_4_ = fVar77 * fVar139 - fVar138 * fVar184;
          auVar219._12_4_ = fVar182 * fVar180 - fVar141 * fVar192;
          auVar244._0_4_ = fVar133 * fVar194 - fVar309 * fVar134;
          auVar244._4_4_ = fVar135 * fVar113 - fVar311 * fVar136;
          auVar244._8_4_ = fVar138 * fVar117 - fVar278 * fVar139;
          auVar244._12_4_ = fVar141 * fVar114 - fVar313 * fVar180;
          auVar229._0_4_ = fVar194 * fVar259 - fVar277 * fVar237;
          auVar229._4_4_ = fVar113 * fVar100 - fVar101 * fVar238;
          auVar229._8_4_ = fVar117 * fVar112 - fVar184 * fVar245;
          auVar229._12_4_ = fVar114 * fVar246 - fVar192 * fVar247;
          auVar28._0_4_ = fVar277 * fVar181 - fVar134 * fVar259;
          auVar28._4_4_ = fVar101 * fVar183 - fVar136 * fVar100;
          auVar28._8_4_ = fVar184 * fVar191 - fVar139 * fVar112;
          auVar28._12_4_ = fVar192 * fVar193 - fVar180 * fVar246;
          auVar147._0_4_ = fVar134 * fVar237 - fVar194 * fVar181;
          auVar147._4_4_ = fVar136 * fVar238 - fVar113 * fVar183;
          auVar147._8_4_ = fVar139 * fVar245 - fVar117 * fVar191;
          auVar147._12_4_ = fVar180 * fVar247 - fVar114 * fVar193;
          auVar304._0_4_ = fVar237 * fVar275 - fVar259 * fVar309;
          auVar304._4_4_ = fVar238 * fVar279 - fVar100 * fVar311;
          auVar304._8_4_ = fVar245 * fVar77 - fVar112 * fVar278;
          auVar304._12_4_ = fVar247 * fVar182 - fVar246 * fVar313;
          auVar319._0_4_ = fVar259 * fVar133 - fVar275 * fVar181;
          auVar319._4_4_ = fVar100 * fVar135 - fVar279 * fVar183;
          auVar319._8_4_ = fVar112 * fVar138 - fVar77 * fVar191;
          auVar319._12_4_ = fVar246 * fVar141 - fVar182 * fVar193;
          auVar129._4_4_ = fVar311 * fVar183 - fVar135 * fVar238;
          auVar129._0_4_ = fVar309 * fVar181 - fVar133 * fVar237;
          auVar129._8_4_ = fVar278 * fVar191 - fVar138 * fVar245;
          auVar129._12_4_ = fVar313 * fVar193 - fVar141 * fVar247;
          auVar187._0_4_ =
               fVar181 * auVar288._0_4_ + fVar237 * auVar219._0_4_ + fVar259 * auVar244._0_4_;
          auVar187._4_4_ =
               fVar183 * auVar288._4_4_ + fVar238 * auVar219._4_4_ + fVar100 * auVar244._4_4_;
          auVar187._8_4_ =
               fVar191 * auVar288._8_4_ + fVar245 * auVar219._8_4_ + fVar112 * auVar244._8_4_;
          auVar187._12_4_ =
               fVar193 * auVar288._12_4_ + fVar247 * auVar219._12_4_ + fVar246 * auVar244._12_4_;
          auVar282 = divps(auVar288,auVar187);
          auVar254 = divps(auVar229,auVar187);
          auVar299 = divps(auVar304,auVar187);
          auVar214 = divps(auVar219,auVar187);
          _local_268 = divps(auVar28,auVar187);
          auVar316 = divps(auVar319,auVar187);
          auVar261 = divps(auVar244,auVar187);
          _local_278 = divps(auVar147,auVar187);
          auVar122 = divps(auVar129,auVar187);
          fVar259 = fVar248 * auVar282._0_4_ + fVar195 * auVar214._0_4_ + fVar115 * auVar261._0_4_;
          fVar275 = fVar276 * auVar282._4_4_ + fVar196 * auVar214._4_4_ + fVar116 * auVar261._4_4_;
          fVar277 = fVar280 * auVar282._8_4_ + fVar209 * auVar214._8_4_ + fVar118 * auVar261._8_4_;
          fVar279 = fVar292 * auVar282._12_4_ +
                    fVar210 * auVar214._12_4_ + fVar119 * auVar261._12_4_;
          fVar100 = fVar248 * auVar254._0_4_ + fVar195 * local_268._0_4_ + fVar115 * local_278._0_4_
          ;
          fVar101 = fVar276 * auVar254._4_4_ + fVar196 * local_268._4_4_ + fVar116 * local_278._4_4_
          ;
          fVar112 = fVar280 * auVar254._8_4_ + fVar209 * local_268._8_4_ + fVar118 * local_278._8_4_
          ;
          fVar77 = fVar292 * auVar254._12_4_ +
                   fVar210 * local_268._12_4_ + fVar119 * local_278._12_4_;
          fVar184 = fVar248 * auVar299._0_4_ + fVar195 * auVar316._0_4_ + fVar115 * auVar122._0_4_;
          fVar246 = fVar276 * auVar299._4_4_ + fVar196 * auVar316._4_4_ + fVar116 * auVar122._4_4_;
          fVar182 = fVar280 * auVar299._8_4_ + fVar209 * auVar316._8_4_ + fVar118 * auVar122._8_4_;
          fVar192 = fVar292 * auVar299._12_4_ +
                    fVar210 * auVar316._12_4_ + fVar119 * auVar122._12_4_;
        }
        else {
          fVar259 = pGVar8->fnumTimeSegments;
          fVar275 = (pGVar8->time_range).lower;
          auVar79._0_4_ = (pGVar8->time_range).upper - fVar275;
          auVar47._4_4_ = fVar275;
          auVar47._0_4_ = fVar275;
          auVar47._8_4_ = fVar275;
          auVar47._12_4_ = fVar275;
          auVar104._4_4_ = fVar259;
          auVar104._0_4_ = fVar259;
          auVar104._8_4_ = fVar259;
          auVar104._12_4_ = fVar259;
          auVar260._0_4_ = *(float *)(ray + 0x70) - fVar275;
          auVar260._4_4_ = *(float *)(ray + 0x74) - fVar275;
          auVar260._8_4_ = *(float *)(ray + 0x78) - fVar275;
          auVar260._12_4_ = *(float *)(ray + 0x7c) - fVar275;
          auVar79._4_4_ = auVar79._0_4_;
          auVar79._8_4_ = auVar79._0_4_;
          auVar79._12_4_ = auVar79._0_4_;
          auVar261 = divps(auVar260,auVar79);
          auVar262._0_4_ = auVar261._0_4_ * fVar259;
          auVar262._4_4_ = auVar261._4_4_ * fVar259;
          auVar262._8_4_ = auVar261._8_4_ * fVar259;
          auVar262._12_4_ = auVar261._12_4_ * fVar259;
          auVar261 = roundps(auVar47,auVar262,1);
          auVar16._0_4_ = fVar259 + -1.0;
          auVar16._4_4_ = auVar16._0_4_;
          auVar16._8_4_ = auVar16._0_4_;
          auVar16._12_4_ = auVar16._0_4_;
          auVar261 = minps(auVar261,auVar16);
          auVar261 = maxps(auVar261,ZEXT816(0));
          fVar259 = auVar262._0_4_ - auVar261._0_4_;
          fVar275 = auVar262._4_4_ - auVar261._4_4_;
          fVar277 = auVar262._8_4_ - auVar261._8_4_;
          fVar279 = auVar262._12_4_ - auVar261._12_4_;
          auVar249._0_4_ = (int)auVar261._0_4_;
          auVar249._4_4_ = (int)auVar261._4_4_;
          auVar249._8_4_ = (int)auVar261._8_4_;
          iStack_4c = (int)auVar261._12_4_;
          local_58 = auVar249;
          lVar5 = 0;
          if ((uVar9 & 0xff) != 0) {
            for (; ((uVar9 & 0xff) >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
            }
          }
          iVar37 = *(int *)(local_58 + lVar5 * 4);
          auVar17._0_4_ = -(uint)(iVar37 == auVar249._0_4_);
          auVar17._4_4_ = -(uint)(iVar37 == auVar249._4_4_);
          auVar17._8_4_ = -(uint)(iVar37 == auVar249._8_4_);
          auVar17._12_4_ = -(uint)(iVar37 == iStack_4c);
          iVar12 = movmskps((int)prim,~auVar17 & auVar122);
          if (iVar12 == 0) {
            lVar5 = *(long *)&pGVar8[1].fnumTimeSegments;
            lVar11 = (long)iVar37 * 0x38;
            plVar10 = (long *)(lVar5 + lVar11);
            iVar37 = *(int *)(lVar5 + 0x20 + lVar11);
            if (iVar37 == 0x9134) {
              lVar4 = *plVar10;
              lVar13 = plVar10[2] * uVar15;
              auVar122 = insertps(ZEXT416(*(uint *)(lVar4 + lVar13)),
                                  *(undefined4 *)(lVar4 + 0x10 + lVar13),0x1c);
              auVar122 = insertps(auVar122,*(undefined4 *)(lVar4 + 0x20 + lVar13),0x28);
              auVar120 = auVar122._0_12_;
              auVar122 = insertps(ZEXT416(*(uint *)(lVar4 + 4 + lVar13)),
                                  *(undefined4 *)(lVar4 + 0x14 + lVar13),0x1c);
              auVar122 = insertps(auVar122,*(undefined4 *)(lVar4 + 0x24 + lVar13),0x28);
              auVar249 = auVar122._0_12_;
              auVar122 = insertps(ZEXT416(*(uint *)(lVar4 + 8 + lVar13)),
                                  *(undefined4 *)(lVar4 + 0x18 + lVar13),0x1c);
              auVar122 = insertps(auVar122,*(undefined4 *)(lVar4 + 0x28 + lVar13),0x28);
              v_12.field_0._0_12_ = auVar122._0_12_;
              auVar122 = insertps(ZEXT416(*(uint *)(lVar4 + 0xc + lVar13)),
                                  *(undefined4 *)(lVar4 + 0x1c + lVar13),0x1c);
              auVar122 = insertps(auVar122,*(undefined4 *)(lVar4 + 0x2c + lVar13),0x28);
              v_2.field_0._0_12_ = auVar122._0_12_;
            }
            else if (iVar37 == 0x9234) {
              lVar4 = *plVar10;
              lVar13 = plVar10[2] * uVar15;
              uVar2 = *(undefined8 *)(lVar4 + 4 + lVar13);
              auVar120._4_4_ = (int)uVar2;
              auVar120._0_4_ = *(undefined4 *)(lVar4 + lVar13);
              auVar120._8_4_ = (int)((ulong)uVar2 >> 0x20);
              uVar2 = *(undefined8 *)(lVar4 + 0x10 + lVar13);
              auVar249._4_4_ = (int)uVar2;
              auVar249._0_4_ = *(undefined4 *)(lVar4 + 0xc + lVar13);
              auVar249._8_4_ = (int)((ulong)uVar2 >> 0x20);
              uVar2 = *(undefined8 *)(lVar4 + 0x1c + lVar13);
              v_12.field_0._4_4_ = (int)uVar2;
              v_12.field_0._0_4_ = *(undefined4 *)(lVar4 + 0x18 + lVar13);
              v_12.field_0._8_4_ = (int)((ulong)uVar2 >> 0x20);
              uVar2 = *(undefined8 *)(lVar4 + 0x28 + lVar13);
              v_2.field_0._4_4_ = (int)uVar2;
              v_2.field_0._0_4_ = *(undefined4 *)(lVar4 + 0x24 + lVar13);
              v_2.field_0._8_4_ = (int)((ulong)uVar2 >> 0x20);
            }
            else if (iVar37 == 0xb001) {
              lVar4 = *plVar10;
              lVar13 = plVar10[2] * uVar15;
              auVar239._8_8_ = 0;
              auVar239._0_8_ = *(ulong *)(lVar4 + 0x10 + lVar13);
              auVar261 = insertps(auVar239,*(undefined4 *)(lVar4 + 8 + lVar13),0x20);
              uVar2 = *(undefined8 *)(lVar4 + 0x34 + lVar13);
              auVar123._4_4_ = (int)uVar2;
              auVar123._0_4_ = *(undefined4 *)(lVar4 + lVar13);
              auVar123._8_4_ = (int)((ulong)uVar2 >> 0x20);
              auVar123._12_4_ = 0;
              uVar2 = *(undefined8 *)(lVar4 + 0x1c + lVar13);
              auVar212._4_4_ = (int)uVar2;
              auVar212._0_4_ = *(undefined4 *)(lVar4 + 0x18 + lVar13);
              auVar212._8_4_ = (int)((ulong)uVar2 >> 0x20);
              auVar212._12_4_ = 0;
              fVar100 = *(float *)(lVar4 + 0x24 + lVar13);
              fVar101 = *(float *)(lVar4 + 0x28 + lVar13);
              fVar112 = *(float *)(lVar4 + 0x2c + lVar13);
              fVar77 = *(float *)(lVar4 + 0x30 + lVar13);
              fVar246 = fVar77 * fVar77 + fVar112 * fVar112 + fVar100 * fVar100 + fVar101 * fVar101;
              auVar122 = rsqrtss(ZEXT416((uint)fVar246),ZEXT416((uint)fVar246));
              fVar184 = auVar122._0_4_;
              v_16.field_0._0_4_ = fVar246 * -0.5 * fVar184;
              v_16.field_0._4_8_ = 0;
              auVar185._4_12_ = auVar122._4_12_;
              fVar184 = fVar184 * fVar184 * v_16.field_0._0_4_ + fVar184 * 1.5;
              auVar122 = insertps(auVar212,ZEXT416((uint)(fVar100 * fVar184)),0x30);
              v_2.field_0._0_12_ = auVar122._0_12_;
              auVar122 = insertps(auVar123,ZEXT416((uint)(fVar101 * fVar184)),0x30);
              auVar120 = auVar122._0_12_;
              auVar185._0_4_ = fVar184 * fVar77;
              auVar214 = insertps(ZEXT416(*(uint *)(lVar4 + 0xc + lVar13)),
                                  *(undefined4 *)(lVar4 + 4 + lVar13),0x10);
              auVar122 = insertps(auVar261,auVar185,0x30);
              v_12.field_0._0_12_ = auVar122._0_12_;
              auVar122 = insertps(auVar214,*(undefined4 *)(lVar4 + 0x3c + lVar13),0x20);
              auVar122 = insertps(auVar122,ZEXT416((uint)(fVar112 * fVar184)),0x30);
              auVar249 = auVar122._0_12_;
            }
            else if (iVar37 == 0x9244) {
              lVar4 = *plVar10;
              lVar13 = plVar10[2] * uVar15;
              auVar120 = SUB1612(*(undefined1 (*) [16])(lVar4 + lVar13),0);
              auVar249 = SUB1612(*(undefined1 (*) [16])(lVar4 + 0x10 + lVar13),0);
              v_12.field_0._0_12_ = SUB1612(*(undefined1 (*) [16])(lVar4 + 0x20 + lVar13),0);
              v_2.field_0._0_12_ = SUB1612(*(undefined1 (*) [16])(lVar4 + 0x30 + lVar13),0);
            }
            fVar100 = auVar120._0_4_;
            fVar101 = auVar120._4_4_;
            fVar112 = auVar120._8_4_;
            fVar113 = auVar249._0_4_;
            fVar117 = auVar249._4_4_;
            auVar250._8_4_ = auVar249._8_4_;
            auVar250._4_4_ = auVar250._8_4_;
            auVar250._0_4_ = auVar250._8_4_;
            fVar182 = v_12.field_0._0_4_;
            fVar192 = v_12.field_0._4_4_;
            fVar194 = v_12.field_0._8_4_;
            fVar77 = v_2.field_0._0_4_;
            fVar184 = v_2.field_0._4_4_;
            fVar246 = v_2.field_0._8_4_;
            auVar46._4_4_ = fVar184;
            auVar46._0_4_ = fVar184;
            auVar46._8_4_ = fVar184;
            iVar37 = *(int *)(lVar5 + 0x58 + lVar11);
            if (iVar37 == 0x9134) {
              lVar5 = plVar10[7];
              lVar11 = uVar15 * plVar10[9];
              auVar122 = insertps(ZEXT416(*(uint *)(lVar5 + lVar11)),
                                  *(undefined4 *)(lVar5 + 0x10 + lVar11),0x1c);
              auVar122 = insertps(auVar122,*(undefined4 *)(lVar5 + 0x20 + lVar11),0x28);
              auVar46 = auVar122._0_12_;
              auVar122 = insertps(ZEXT416(*(uint *)(lVar5 + 4 + lVar11)),
                                  *(undefined4 *)(lVar5 + 0x14 + lVar11),0x1c);
              auVar122 = insertps(auVar122,*(undefined4 *)(lVar5 + 0x24 + lVar11),0x28);
              v_15.field_0._0_12_ = auVar122._0_12_;
              auVar122 = insertps(ZEXT416(*(uint *)(lVar5 + 8 + lVar11)),
                                  *(undefined4 *)(lVar5 + 0x18 + lVar11),0x1c);
              auVar122 = insertps(auVar122,*(undefined4 *)(lVar5 + 0x28 + lVar11),0x28);
              v_16.field_0._0_12_ = auVar122._0_12_;
              auVar122 = insertps(ZEXT416(*(uint *)(lVar5 + 0xc + lVar11)),
                                  *(undefined4 *)(lVar5 + 0x1c + lVar11),0x1c);
              auVar122 = insertps(auVar122,*(undefined4 *)(lVar5 + 0x2c + lVar11),0x28);
              auVar251 = auVar122._0_12_;
            }
            else if (iVar37 == 0x9234) {
              lVar5 = plVar10[7];
              lVar11 = uVar15 * plVar10[9];
              uVar2 = *(undefined8 *)(lVar5 + 4 + lVar11);
              auVar46._4_4_ = (int)uVar2;
              auVar46._0_4_ = *(undefined4 *)(lVar5 + lVar11);
              auVar46._8_4_ = (int)((ulong)uVar2 >> 0x20);
              uVar2 = *(undefined8 *)(lVar5 + 0x10 + lVar11);
              v_15.field_0._4_4_ = (int)uVar2;
              v_15.field_0._0_4_ = *(undefined4 *)(lVar5 + 0xc + lVar11);
              v_15.field_0._8_4_ = (int)((ulong)uVar2 >> 0x20);
              uVar2 = *(undefined8 *)(lVar5 + 0x1c + lVar11);
              v_16.field_0._4_4_ = (int)uVar2;
              v_16.field_0._0_4_ = (float)*(undefined4 *)(lVar5 + 0x18 + lVar11);
              v_16.field_0._8_4_ = (int)((ulong)uVar2 >> 0x20);
              uVar2 = *(undefined8 *)(lVar5 + 0x28 + lVar11);
              auVar251._4_4_ = (int)uVar2;
              auVar251._0_4_ = *(undefined4 *)(lVar5 + 0x24 + lVar11);
              auVar251._8_4_ = (int)((ulong)uVar2 >> 0x20);
            }
            else if (iVar37 == 0xb001) {
              lVar5 = plVar10[7];
              lVar11 = uVar15 * plVar10[9];
              auVar224._8_8_ = 0;
              auVar224._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar11);
              auVar261 = insertps(auVar224,*(undefined4 *)(lVar5 + 8 + lVar11),0x20);
              uVar2 = *(undefined8 *)(lVar5 + 0x34 + lVar11);
              auVar48._4_4_ = (int)uVar2;
              auVar48._0_4_ = *(undefined4 *)(lVar5 + lVar11);
              auVar48._8_4_ = (int)((ulong)uVar2 >> 0x20);
              auVar48._12_4_ = 0;
              uVar2 = *(undefined8 *)(lVar5 + 0x1c + lVar11);
              auVar252._4_4_ = (int)uVar2;
              auVar252._0_4_ = *(undefined4 *)(lVar5 + 0x18 + lVar11);
              auVar252._8_4_ = (int)((ulong)uVar2 >> 0x20);
              auVar252._12_4_ = 0;
              fVar114 = *(float *)(lVar5 + 0x24 + lVar11);
              fVar115 = *(float *)(lVar5 + 0x28 + lVar11);
              fVar116 = *(float *)(lVar5 + 0x2c + lVar11);
              fVar118 = *(float *)(lVar5 + 0x30 + lVar11);
              fVar133 = fVar118 * fVar118 +
                        fVar116 * fVar116 + fVar114 * fVar114 + fVar115 * fVar115;
              auVar122 = rsqrtss(ZEXT416((uint)fVar133),ZEXT416((uint)fVar133));
              fVar119 = auVar122._0_4_;
              auVar80._4_12_ = auVar122._4_12_;
              fVar119 = fVar119 * fVar119 * fVar133 * -0.5 * fVar119 + fVar119 * 1.5;
              auVar122 = insertps(auVar252,ZEXT416((uint)(fVar114 * fVar119)),0x30);
              auVar251 = auVar122._0_12_;
              auVar122 = insertps(auVar48,ZEXT416((uint)(fVar115 * fVar119)),0x30);
              auVar46 = auVar122._0_12_;
              auVar80._0_4_ = fVar119 * fVar118;
              auVar214 = insertps(ZEXT416(*(uint *)(lVar5 + 0xc + lVar11)),
                                  *(undefined4 *)(lVar5 + 4 + lVar11),0x10);
              auVar122 = insertps(auVar261,auVar80,0x30);
              v_16.field_0._0_12_ = auVar122._0_12_;
              auVar122 = insertps(auVar214,*(undefined4 *)(lVar5 + 0x3c + lVar11),0x20);
              auVar122 = insertps(auVar122,ZEXT416((uint)(fVar116 * fVar119)),0x30);
              v_15.field_0._0_12_ = auVar122._0_12_;
            }
            else {
              auVar251 = auVar250;
              if (iVar37 == 0x9244) {
                lVar5 = plVar10[7];
                lVar11 = uVar15 * plVar10[9];
                auVar46 = SUB1612(*(undefined1 (*) [16])(lVar5 + lVar11),0);
                v_15.field_0._0_12_ = SUB1612(*(undefined1 (*) [16])(lVar5 + 0x10 + lVar11),0);
                v_16.field_0._0_12_ = SUB1612(*(undefined1 (*) [16])(lVar5 + 0x20 + lVar11),0);
                auVar251 = SUB1612(*(undefined1 (*) [16])(lVar5 + 0x30 + lVar11),0);
              }
            }
            fVar114 = auVar46._0_4_;
            fVar115 = auVar46._4_4_;
            fVar116 = auVar46._8_4_;
            fVar183 = 1.0 - fVar259;
            fVar191 = 1.0 - fVar275;
            fVar193 = 1.0 - fVar277;
            fVar195 = 1.0 - fVar279;
            fVar196 = fVar100 * fVar183 + fVar114 * fVar259;
            fVar209 = fVar100 * fVar191 + fVar114 * fVar275;
            fVar210 = fVar100 * fVar193 + fVar114 * fVar277;
            fVar211 = fVar100 * fVar195 + fVar114 * fVar279;
            fVar280 = fVar101 * fVar183 + fVar115 * fVar259;
            fVar292 = fVar101 * fVar191 + fVar115 * fVar275;
            fVar293 = fVar101 * fVar193 + fVar115 * fVar277;
            fVar294 = fVar101 * fVar195 + fVar115 * fVar279;
            fVar118 = fVar112 * fVar183 + fVar116 * fVar259;
            fVar133 = fVar112 * fVar191 + fVar116 * fVar275;
            fVar135 = fVar112 * fVar193 + fVar116 * fVar277;
            fVar138 = fVar112 * fVar195 + fVar116 * fVar279;
            fVar101 = v_15.field_0._0_4_;
            fVar119 = v_15.field_0._4_4_;
            fVar139 = v_15.field_0._8_4_;
            fVar100 = fVar113 * fVar183 + fVar101 * fVar259;
            fVar112 = fVar113 * fVar191 + fVar101 * fVar275;
            fVar114 = fVar113 * fVar193 + fVar101 * fVar277;
            fVar116 = fVar113 * fVar195 + fVar101 * fVar279;
            fVar101 = fVar117 * fVar183 + fVar119 * fVar259;
            fVar113 = fVar117 * fVar191 + fVar119 * fVar275;
            fVar115 = fVar117 * fVar193 + fVar119 * fVar277;
            fVar117 = fVar117 * fVar195 + fVar119 * fVar279;
            fVar119 = auVar250._8_4_ * fVar183 + fVar139 * fVar259;
            fVar134 = auVar250._8_4_ * fVar191 + fVar139 * fVar275;
            fVar136 = auVar250._8_4_ * fVar193 + fVar139 * fVar277;
            fVar139 = auVar250._8_4_ * fVar195 + fVar139 * fVar279;
            fVar222 = v_16.field_0._0_4_;
            fVar223 = v_16.field_0._4_4_;
            fVar232 = v_16.field_0._8_4_;
            fVar141 = fVar182 * fVar183 + fVar222 * fVar259;
            fVar180 = fVar182 * fVar191 + fVar222 * fVar275;
            fVar181 = fVar182 * fVar193 + fVar222 * fVar277;
            fVar182 = fVar182 * fVar195 + fVar222 * fVar279;
            fVar296 = fVar192 * fVar183 + fVar223 * fVar259;
            fVar307 = fVar192 * fVar191 + fVar223 * fVar275;
            fVar309 = fVar192 * fVar193 + fVar223 * fVar277;
            fVar311 = fVar192 * fVar195 + fVar223 * fVar279;
            fVar192 = auVar251._0_4_;
            fVar237 = auVar251._4_4_;
            fVar276 = auVar251._8_4_;
            fVar238 = fVar194 * fVar183 + fVar232 * fVar259;
            fVar245 = fVar194 * fVar191 + fVar232 * fVar275;
            fVar247 = fVar194 * fVar193 + fVar232 * fVar277;
            fVar248 = fVar194 * fVar195 + fVar232 * fVar279;
            fVar222 = fVar77 * fVar183 + fVar192 * fVar259;
            fVar232 = fVar77 * fVar191 + fVar192 * fVar275;
            fVar234 = fVar77 * fVar193 + fVar192 * fVar277;
            fVar236 = fVar77 * fVar195 + fVar192 * fVar279;
            fVar223 = fVar184 * fVar183 + fVar237 * fVar259;
            fVar233 = fVar184 * fVar191 + fVar237 * fVar275;
            fVar235 = fVar184 * fVar193 + fVar237 * fVar277;
            fVar237 = fVar184 * fVar195 + fVar237 * fVar279;
            fVar184 = fVar183 * fVar246 + fVar276 * fVar259;
            fVar192 = fVar191 * fVar246 + fVar276 * fVar275;
            fVar194 = fVar193 * fVar246 + fVar276 * fVar277;
            fVar183 = fVar195 * fVar246 + fVar276 * fVar279;
            fVar259 = fVar101 * fVar238 - fVar119 * fVar296;
            fVar275 = fVar113 * fVar245 - fVar134 * fVar307;
            auVar281._4_4_ = fVar275;
            auVar281._0_4_ = fVar259;
            fVar277 = fVar115 * fVar247 - fVar136 * fVar309;
            fVar279 = fVar117 * fVar248 - fVar139 * fVar311;
            auVar213._0_4_ = fVar119 * fVar141 - fVar100 * fVar238;
            auVar213._4_4_ = fVar134 * fVar180 - fVar112 * fVar245;
            auVar213._8_4_ = fVar136 * fVar181 - fVar114 * fVar247;
            auVar213._12_4_ = fVar139 * fVar182 - fVar116 * fVar248;
            auVar263._0_4_ = fVar100 * fVar296 - fVar101 * fVar141;
            auVar263._4_4_ = fVar112 * fVar307 - fVar113 * fVar180;
            auVar263._8_4_ = fVar114 * fVar309 - fVar115 * fVar181;
            auVar263._12_4_ = fVar116 * fVar311 - fVar117 * fVar182;
            auVar253._0_4_ = fVar118 * fVar296 - fVar280 * fVar238;
            auVar253._4_4_ = fVar133 * fVar307 - fVar292 * fVar245;
            auVar253._8_4_ = fVar135 * fVar309 - fVar293 * fVar247;
            auVar253._12_4_ = fVar138 * fVar311 - fVar294 * fVar248;
            auVar240._0_4_ = fVar238 * fVar196 - fVar118 * fVar141;
            auVar240._4_4_ = fVar245 * fVar209 - fVar133 * fVar180;
            auVar240._8_4_ = fVar247 * fVar210 - fVar135 * fVar181;
            auVar240._12_4_ = fVar248 * fVar211 - fVar138 * fVar182;
            auVar142._0_4_ = fVar141 * fVar280 - fVar296 * fVar196;
            auVar142._4_4_ = fVar180 * fVar292 - fVar307 * fVar209;
            auVar142._8_4_ = fVar181 * fVar293 - fVar309 * fVar210;
            auVar142._12_4_ = fVar182 * fVar294 - fVar311 * fVar211;
            auVar298._0_4_ = fVar280 * fVar119 - fVar118 * fVar101;
            auVar298._4_4_ = fVar292 * fVar134 - fVar133 * fVar113;
            auVar298._8_4_ = fVar293 * fVar136 - fVar135 * fVar115;
            auVar298._12_4_ = fVar294 * fVar139 - fVar138 * fVar117;
            auVar315._0_4_ = fVar118 * fVar100 - fVar119 * fVar196;
            auVar315._4_4_ = fVar133 * fVar112 - fVar134 * fVar209;
            auVar315._8_4_ = fVar135 * fVar114 - fVar136 * fVar210;
            auVar315._12_4_ = fVar138 * fVar116 - fVar139 * fVar211;
            auVar102._0_4_ = fVar101 * fVar196 - fVar100 * fVar280;
            auVar102._4_4_ = fVar113 * fVar209 - fVar112 * fVar292;
            auVar102._8_4_ = fVar115 * fVar210 - fVar114 * fVar293;
            auVar102._12_4_ = fVar117 * fVar211 - fVar116 * fVar294;
            auVar197._0_4_ = fVar196 * fVar259 + fVar280 * auVar213._0_4_ + fVar118 * auVar263._0_4_
            ;
            auVar197._4_4_ = fVar209 * fVar275 + fVar292 * auVar213._4_4_ + fVar133 * auVar263._4_4_
            ;
            auVar197._8_4_ = fVar210 * fVar277 + fVar293 * auVar213._8_4_ + fVar135 * auVar263._8_4_
            ;
            auVar197._12_4_ =
                 fVar211 * fVar279 + fVar294 * auVar213._12_4_ + fVar138 * auVar263._12_4_;
            auVar281._8_4_ = fVar277;
            auVar281._12_4_ = fVar279;
            auVar282 = divps(auVar281,auVar197);
            auVar254 = divps(auVar253,auVar197);
            auVar299 = divps(auVar298,auVar197);
            auVar214 = divps(auVar213,auVar197);
            _local_268 = divps(auVar240,auVar197);
            auVar316 = divps(auVar315,auVar197);
            auVar261 = divps(auVar263,auVar197);
            _local_278 = divps(auVar142,auVar197);
            auVar122 = divps(auVar102,auVar197);
            fVar259 = fVar222 * auVar282._0_4_ + fVar223 * auVar214._0_4_ + fVar184 * auVar261._0_4_
            ;
            fVar275 = fVar232 * auVar282._4_4_ + fVar233 * auVar214._4_4_ + fVar192 * auVar261._4_4_
            ;
            fVar277 = fVar234 * auVar282._8_4_ + fVar235 * auVar214._8_4_ + fVar194 * auVar261._8_4_
            ;
            fVar279 = fVar236 * auVar282._12_4_ +
                      fVar237 * auVar214._12_4_ + fVar183 * auVar261._12_4_;
            fVar100 = fVar222 * auVar254._0_4_ +
                      fVar223 * local_268._0_4_ + fVar184 * local_278._0_4_;
            fVar101 = fVar232 * auVar254._4_4_ +
                      fVar233 * local_268._4_4_ + fVar192 * local_278._4_4_;
            fVar112 = fVar234 * auVar254._8_4_ +
                      fVar235 * local_268._8_4_ + fVar194 * local_278._8_4_;
            fVar77 = fVar236 * auVar254._12_4_ +
                     fVar237 * local_268._12_4_ + fVar183 * local_278._12_4_;
            fVar184 = fVar222 * auVar299._0_4_ + fVar223 * auVar316._0_4_ + fVar184 * auVar122._0_4_
            ;
            fVar246 = fVar232 * auVar299._4_4_ + fVar233 * auVar316._4_4_ + fVar192 * auVar122._4_4_
            ;
            fVar182 = fVar234 * auVar299._8_4_ + fVar235 * auVar316._8_4_ + fVar194 * auVar122._8_4_
            ;
            fVar192 = fVar236 * auVar299._12_4_ +
                      fVar237 * auVar316._12_4_ + fVar183 * auVar122._12_4_;
          }
          else {
            if (uVar9 != 0) {
              lVar5 = *(long *)&pGVar8[1].fnumTimeSegments;
              auVar261 = auVar122;
              do {
                lVar11 = 0;
                if ((uVar9 & 0xf) != 0) {
                  for (; ((uVar9 & 0xf) >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                  }
                }
                iVar37 = *(int *)(local_58 + (long)(int)lVar11 * 4);
                auVar19._0_4_ = -(uint)(iVar37 == auVar249._0_4_);
                auVar19._4_4_ = -(uint)(iVar37 == auVar249._4_4_);
                auVar19._8_4_ = -(uint)(iVar37 == auVar249._8_4_);
                auVar19._12_4_ = -(uint)(iVar37 == iStack_4c);
                auVar19 = auVar19 & auVar261;
                lVar11 = (long)iVar37 * 0x38;
                plVar10 = (long *)(lVar5 + lVar11);
                iVar37 = *(int *)(lVar5 + 0x20 + lVar11);
                if (iVar37 == 0x9134) {
                  lVar4 = *plVar10;
                  lVar13 = plVar10[2] * uVar15;
                  auVar214 = insertps(ZEXT416(*(uint *)(lVar4 + lVar13)),
                                      *(undefined4 *)(lVar4 + 0x10 + lVar13),0x1c);
                  _local_278 = insertps(auVar214,*(undefined4 *)(lVar4 + 0x20 + lVar13),0x28);
                  auVar214 = insertps(ZEXT416(*(uint *)(lVar4 + 4 + lVar13)),
                                      *(undefined4 *)(lVar4 + 0x14 + lVar13),0x1c);
                  in_XMM10 = insertps(auVar214,*(undefined4 *)(lVar4 + 0x24 + lVar13),0x28);
                  auVar214 = insertps(ZEXT416(*(uint *)(lVar4 + 8 + lVar13)),
                                      *(undefined4 *)(lVar4 + 0x18 + lVar13),0x1c);
                  _local_c8 = insertps(auVar214,*(undefined4 *)(lVar4 + 0x28 + lVar13),0x28);
                  auVar214 = insertps(ZEXT416(*(uint *)(lVar4 + 0xc + lVar13)),
                                      *(undefined4 *)(lVar4 + 0x1c + lVar13),0x1c);
                  in_XMM15 = insertps(auVar214,*(undefined4 *)(lVar4 + 0x2c + lVar13),0x28);
                }
                else if (iVar37 == 0x9234) {
                  lVar4 = *plVar10;
                  lVar13 = plVar10[2] * uVar15;
                  uVar2 = *(undefined8 *)(lVar4 + 4 + lVar13);
                  local_278._4_4_ = (int)uVar2;
                  local_278._0_4_ = *(undefined4 *)(lVar4 + lVar13);
                  fStack_270 = (float)(int)((ulong)uVar2 >> 0x20);
                  fStack_26c = 0.0;
                  uVar2 = *(undefined8 *)(lVar4 + 0x10 + lVar13);
                  in_XMM10._4_4_ = (int)uVar2;
                  in_XMM10._0_4_ = *(undefined4 *)(lVar4 + 0xc + lVar13);
                  in_XMM10._8_4_ = (int)((ulong)uVar2 >> 0x20);
                  in_XMM10._12_4_ = 0;
                  uVar2 = *(undefined8 *)(lVar4 + 0x1c + lVar13);
                  local_c8._4_4_ = (int)uVar2;
                  local_c8._0_4_ = *(undefined4 *)(lVar4 + 0x18 + lVar13);
                  fStack_c0 = (float)(int)((ulong)uVar2 >> 0x20);
                  fStack_bc = 0.0;
                  uVar2 = *(undefined8 *)(lVar4 + 0x28 + lVar13);
                  in_XMM15._4_4_ = (int)uVar2;
                  in_XMM15._0_4_ = *(undefined4 *)(lVar4 + 0x24 + lVar13);
                  in_XMM15._8_4_ = (int)((ulong)uVar2 >> 0x20);
                  in_XMM15._12_4_ = 0;
                }
                else if (iVar37 == 0xb001) {
                  lVar4 = *plVar10;
                  lVar13 = plVar10[2] * uVar15;
                  auVar283._8_8_ = 0;
                  auVar283._0_8_ = *(ulong *)(lVar4 + 0x10 + lVar13);
                  auVar254 = insertps(auVar283,*(undefined4 *)(lVar4 + 8 + lVar13),0x20);
                  uVar2 = *(undefined8 *)(lVar4 + 0x34 + lVar13);
                  auVar300._4_4_ = (int)uVar2;
                  auVar300._0_4_ = *(undefined4 *)(lVar4 + lVar13);
                  auVar300._8_4_ = (int)((ulong)uVar2 >> 0x20);
                  auVar300._12_4_ = 0;
                  uVar2 = *(undefined8 *)(lVar4 + 0x1c + lVar13);
                  auVar317._4_4_ = (int)uVar2;
                  auVar317._0_4_ = *(undefined4 *)(lVar4 + 0x18 + lVar13);
                  auVar317._8_4_ = (int)((ulong)uVar2 >> 0x20);
                  auVar317._12_4_ = 0;
                  fVar100 = *(float *)(lVar4 + 0x24 + lVar13);
                  fVar101 = *(float *)(lVar4 + 0x28 + lVar13);
                  fVar112 = *(float *)(lVar4 + 0x2c + lVar13);
                  fVar77 = *(float *)(lVar4 + 0x30 + lVar13);
                  fVar246 = fVar77 * fVar77 +
                            fVar112 * fVar112 + fVar100 * fVar100 + fVar101 * fVar101;
                  auVar214 = rsqrtss(ZEXT416((uint)fVar246),ZEXT416((uint)fVar246));
                  fVar184 = auVar214._0_4_;
                  fVar184 = fVar184 * fVar184 * fVar246 * -0.5 * fVar184 + fVar184 * 1.5;
                  in_XMM15 = insertps(auVar317,ZEXT416((uint)(fVar100 * fVar184)),0x30);
                  _local_278 = insertps(auVar300,ZEXT416((uint)(fVar101 * fVar184)),0x30);
                  auVar103._0_4_ = fVar184 * fVar77;
                  auVar103._4_12_ = auVar214._4_12_;
                  auVar214 = insertps(ZEXT416(*(uint *)(lVar4 + 0xc + lVar13)),
                                      *(undefined4 *)(lVar4 + 4 + lVar13),0x10);
                  _local_c8 = insertps(auVar254,auVar103,0x30);
                  auVar214 = insertps(auVar214,*(undefined4 *)(lVar4 + 0x3c + lVar13),0x20);
                  in_XMM10 = insertps(auVar214,ZEXT416((uint)(fVar112 * fVar184)),0x30);
                }
                else if (iVar37 == 0x9244) {
                  lVar4 = *plVar10;
                  lVar13 = plVar10[2] * uVar15;
                  _local_278 = *(undefined1 (*) [16])(lVar4 + lVar13);
                  in_XMM10 = *(undefined1 (*) [16])(lVar4 + 0x10 + lVar13);
                  _local_c8 = *(undefined1 (*) [16])(lVar4 + 0x20 + lVar13);
                  in_XMM15 = *(undefined1 (*) [16])(lVar4 + 0x30 + lVar13);
                }
                uVar45 = local_278._0_4_;
                uVar75 = local_278._4_4_;
                auVar301._8_4_ = local_278._8_4_;
                auVar49._4_4_ = uVar45;
                auVar49._0_4_ = uVar45;
                auVar49._8_4_ = uVar45;
                auVar49._12_4_ = uVar45;
                _local_1c8 = blendvps(_local_1c8,auVar49,auVar19);
                auVar50._4_4_ = uVar75;
                auVar50._0_4_ = uVar75;
                auVar50._8_4_ = uVar75;
                auVar50._12_4_ = uVar75;
                _local_1b8 = blendvps(_local_1b8,auVar50,auVar19);
                auVar301._4_4_ = auVar301._8_4_;
                auVar301._0_4_ = auVar301._8_4_;
                auVar301._12_4_ = auVar301._8_4_;
                _local_1e8 = blendvps(_local_1e8,auVar301,auVar19);
                uVar45 = in_XMM10._0_4_;
                uVar75 = in_XMM10._4_4_;
                uVar76 = in_XMM10._8_4_;
                auVar51._4_4_ = uVar45;
                auVar51._0_4_ = uVar45;
                auVar51._8_4_ = uVar45;
                auVar51._12_4_ = uVar45;
                _local_198 = blendvps(_local_198,auVar51,auVar19);
                auVar52._4_4_ = uVar75;
                auVar52._0_4_ = uVar75;
                auVar52._8_4_ = uVar75;
                auVar52._12_4_ = uVar75;
                _local_228 = blendvps(_local_228,auVar52,auVar19);
                auVar53._4_4_ = uVar76;
                auVar53._0_4_ = uVar76;
                auVar53._8_4_ = uVar76;
                auVar53._12_4_ = uVar76;
                _local_1a8 = blendvps(_local_1a8,auVar53,auVar19);
                uVar45 = local_c8._0_4_;
                uVar75 = local_c8._4_4_;
                auVar284._8_4_ = local_c8._8_4_;
                auVar54._4_4_ = uVar45;
                auVar54._0_4_ = uVar45;
                auVar54._8_4_ = uVar45;
                auVar54._12_4_ = uVar45;
                in_XMM5 = blendvps(in_XMM5,auVar54,auVar19);
                auVar55._4_4_ = uVar75;
                auVar55._0_4_ = uVar75;
                auVar55._8_4_ = uVar75;
                auVar55._12_4_ = uVar75;
                in_XMM6 = blendvps(in_XMM6,auVar55,auVar19);
                auVar284._4_4_ = auVar284._8_4_;
                auVar284._0_4_ = auVar284._8_4_;
                auVar284._12_4_ = auVar284._8_4_;
                auVar122 = blendvps(auVar122,auVar284,auVar19);
                uVar45 = in_XMM15._0_4_;
                uVar75 = in_XMM15._4_4_;
                uVar76 = in_XMM15._8_4_;
                auVar56._4_4_ = uVar45;
                auVar56._0_4_ = uVar45;
                auVar56._8_4_ = uVar45;
                auVar56._12_4_ = uVar45;
                auVar104 = blendvps(auVar104,auVar56,auVar19);
                auVar57._4_4_ = uVar75;
                auVar57._0_4_ = uVar75;
                auVar57._8_4_ = uVar75;
                auVar57._12_4_ = uVar75;
                _local_248 = blendvps(_local_248,auVar57,auVar19);
                auVar58._4_4_ = uVar76;
                auVar58._0_4_ = uVar76;
                auVar58._8_4_ = uVar76;
                auVar58._12_4_ = uVar76;
                _local_1d8 = blendvps(_local_1d8,auVar58,auVar19);
                auVar261 = auVar261 ^ auVar19;
                iVar37 = *(int *)(lVar5 + 0x58 + lVar11);
                if (iVar37 == 0x9134) {
                  lVar11 = plVar10[7];
                  plVar10 = (long *)(plVar10[9] * uVar15);
                  auVar214 = insertps(ZEXT416(*(uint *)(lVar11 + (long)plVar10)),
                                      *(undefined4 *)(lVar11 + 0x10 + (long)plVar10),0x1c);
                  in_XMM13 = insertps(auVar214,*(undefined4 *)(lVar11 + 0x20 + (long)plVar10),0x28);
                  auVar214 = insertps(ZEXT416(*(uint *)(lVar11 + 4 + (long)plVar10)),
                                      *(undefined4 *)(lVar11 + 0x14 + (long)plVar10),0x1c);
                  in_XMM8 = insertps(auVar214,*(undefined4 *)(lVar11 + 0x24 + (long)plVar10),0x28);
                  auVar214 = insertps(ZEXT416(*(uint *)(lVar11 + 8 + (long)plVar10)),
                                      *(undefined4 *)(lVar11 + 0x18 + (long)plVar10),0x1c);
                  _local_d8 = insertps(auVar214,*(undefined4 *)(lVar11 + 0x28 + (long)plVar10),0x28)
                  ;
                  auVar214 = insertps(ZEXT416(*(uint *)(lVar11 + 0xc + (long)plVar10)),
                                      *(undefined4 *)(lVar11 + 0x1c + (long)plVar10),0x1c);
                  in_XMM7 = insertps(auVar214,*(undefined4 *)(lVar11 + 0x2c + (long)plVar10),0x28);
                }
                else if (iVar37 == 0x9234) {
                  lVar11 = plVar10[7];
                  plVar10 = (long *)(plVar10[9] * uVar15);
                  uVar2 = *(undefined8 *)(lVar11 + 4 + (long)plVar10);
                  in_XMM13._4_4_ = (int)uVar2;
                  in_XMM13._0_4_ = *(undefined4 *)(lVar11 + (long)plVar10);
                  in_XMM13._8_4_ = (int)((ulong)uVar2 >> 0x20);
                  in_XMM13._12_4_ = 0;
                  uVar2 = *(undefined8 *)(lVar11 + 0x10 + (long)plVar10);
                  in_XMM8._4_4_ = (int)uVar2;
                  in_XMM8._0_4_ = *(undefined4 *)(lVar11 + 0xc + (long)plVar10);
                  in_XMM8._8_4_ = (int)((ulong)uVar2 >> 0x20);
                  in_XMM8._12_4_ = 0;
                  uVar2 = *(undefined8 *)(lVar11 + 0x1c + (long)plVar10);
                  local_d8._4_4_ = (int)uVar2;
                  local_d8._0_4_ = *(undefined4 *)(lVar11 + 0x18 + (long)plVar10);
                  fStack_d0 = (float)(int)((ulong)uVar2 >> 0x20);
                  fStack_cc = 0.0;
                  uVar2 = *(undefined8 *)(lVar11 + 0x28 + (long)plVar10);
                  in_XMM7._4_4_ = (int)uVar2;
                  in_XMM7._0_4_ = *(undefined4 *)(lVar11 + 0x24 + (long)plVar10);
                  in_XMM7._8_4_ = (int)((ulong)uVar2 >> 0x20);
                  in_XMM7._12_4_ = 0;
                }
                else if (iVar37 == 0xb001) {
                  lVar11 = plVar10[7];
                  plVar10 = (long *)(plVar10[9] * uVar15);
                  auVar266._8_8_ = 0;
                  auVar266._0_8_ = *(ulong *)(lVar11 + 0x10 + (long)plVar10);
                  auVar254 = insertps(auVar266,*(undefined4 *)(lVar11 + 8 + (long)plVar10),0x20);
                  uVar2 = *(undefined8 *)(lVar11 + 0x34 + (long)plVar10);
                  auVar285._4_4_ = (int)uVar2;
                  auVar285._0_4_ = *(undefined4 *)(lVar11 + (long)plVar10);
                  auVar285._8_4_ = (int)((ulong)uVar2 >> 0x20);
                  auVar285._12_4_ = 0;
                  uVar2 = *(undefined8 *)(lVar11 + 0x1c + (long)plVar10);
                  auVar198._4_4_ = (int)uVar2;
                  auVar198._0_4_ = *(undefined4 *)(lVar11 + 0x18 + (long)plVar10);
                  auVar198._8_4_ = (int)((ulong)uVar2 >> 0x20);
                  auVar198._12_4_ = 0;
                  fVar100 = *(float *)(lVar11 + 0x24 + (long)plVar10);
                  fVar101 = *(float *)(lVar11 + 0x28 + (long)plVar10);
                  fVar112 = *(float *)(lVar11 + 0x2c + (long)plVar10);
                  fVar77 = *(float *)(lVar11 + 0x30 + (long)plVar10);
                  fVar246 = fVar77 * fVar77 +
                            fVar112 * fVar112 + fVar100 * fVar100 + fVar101 * fVar101;
                  auVar214 = rsqrtss(ZEXT416((uint)fVar246),ZEXT416((uint)fVar246));
                  fVar184 = auVar214._0_4_;
                  fVar184 = fVar184 * fVar184 * fVar246 * -0.5 * fVar184 + fVar184 * 1.5;
                  in_XMM7 = insertps(auVar198,ZEXT416((uint)(fVar100 * fVar184)),0x30);
                  in_XMM13 = insertps(auVar285,ZEXT416((uint)(fVar101 * fVar184)),0x30);
                  auVar124._0_4_ = fVar184 * fVar77;
                  auVar124._4_12_ = auVar214._4_12_;
                  auVar214 = insertps(ZEXT416(*(uint *)(lVar11 + 0xc + (long)plVar10)),
                                      *(undefined4 *)(lVar11 + 4 + (long)plVar10),0x10);
                  _local_d8 = insertps(auVar254,auVar124,0x30);
                  auVar214 = insertps(auVar214,*(undefined4 *)(lVar11 + 0x3c + (long)plVar10),0x20);
                  in_XMM8 = insertps(auVar214,ZEXT416((uint)(fVar112 * fVar184)),0x30);
                }
                else if (iVar37 == 0x9244) {
                  lVar11 = plVar10[7];
                  plVar10 = (long *)(plVar10[9] * uVar15);
                  in_XMM13 = *(undefined1 (*) [16])(lVar11 + (long)plVar10);
                  in_XMM8 = *(undefined1 (*) [16])(lVar11 + 0x10 + (long)plVar10);
                  _local_d8 = *(undefined1 (*) [16])(lVar11 + 0x20 + (long)plVar10);
                  in_XMM7 = *(undefined1 (*) [16])(lVar11 + 0x30 + (long)plVar10);
                }
                uVar45 = in_XMM13._0_4_;
                uVar75 = in_XMM13._4_4_;
                uVar76 = in_XMM13._8_4_;
                auVar59._4_4_ = uVar45;
                auVar59._0_4_ = uVar45;
                auVar59._8_4_ = uVar45;
                auVar59._12_4_ = uVar45;
                _local_138 = blendvps(_local_138,auVar59,auVar19);
                auVar60._4_4_ = uVar75;
                auVar60._0_4_ = uVar75;
                auVar60._8_4_ = uVar75;
                auVar60._12_4_ = uVar75;
                _local_128 = blendvps(_local_128,auVar60,auVar19);
                auVar61._4_4_ = uVar76;
                auVar61._0_4_ = uVar76;
                auVar61._8_4_ = uVar76;
                auVar61._12_4_ = uVar76;
                _local_118 = blendvps(_local_118,auVar61,auVar19);
                uVar45 = in_XMM8._0_4_;
                uVar75 = in_XMM8._4_4_;
                uVar76 = in_XMM8._8_4_;
                auVar62._4_4_ = uVar45;
                auVar62._0_4_ = uVar45;
                auVar62._8_4_ = uVar45;
                auVar62._12_4_ = uVar45;
                _local_148 = blendvps(_local_148,auVar62,auVar19);
                auVar63._4_4_ = uVar75;
                auVar63._0_4_ = uVar75;
                auVar63._8_4_ = uVar75;
                auVar63._12_4_ = uVar75;
                _local_188 = blendvps(_local_188,auVar63,auVar19);
                auVar64._4_4_ = uVar76;
                auVar64._0_4_ = uVar76;
                auVar64._8_4_ = uVar76;
                auVar64._12_4_ = uVar76;
                _local_178 = blendvps(_local_178,auVar64,auVar19);
                uVar45 = local_d8._0_4_;
                uVar75 = local_d8._4_4_;
                auVar267._8_4_ = local_d8._8_4_;
                auVar65._4_4_ = uVar45;
                auVar65._0_4_ = uVar45;
                auVar65._8_4_ = uVar45;
                auVar65._12_4_ = uVar45;
                _local_b8 = blendvps(_local_b8,auVar65,auVar19);
                auVar66._4_4_ = uVar75;
                auVar66._0_4_ = uVar75;
                auVar66._8_4_ = uVar75;
                auVar66._12_4_ = uVar75;
                _local_1f8 = blendvps(_local_1f8,auVar66,auVar19);
                auVar267._4_4_ = auVar267._8_4_;
                auVar267._0_4_ = auVar267._8_4_;
                auVar267._12_4_ = auVar267._8_4_;
                _local_218 = blendvps(_local_218,auVar267,auVar19);
                uVar45 = in_XMM7._0_4_;
                uVar75 = in_XMM7._4_4_;
                uVar76 = in_XMM7._8_4_;
                auVar67._4_4_ = uVar45;
                auVar67._0_4_ = uVar45;
                auVar67._8_4_ = uVar45;
                auVar67._12_4_ = uVar45;
                _local_208 = blendvps(_local_208,auVar67,auVar19);
                auVar68._4_4_ = uVar75;
                auVar68._0_4_ = uVar75;
                auVar68._8_4_ = uVar75;
                auVar68._12_4_ = uVar75;
                _local_258 = blendvps(_local_258,auVar68,auVar19);
                auVar69._4_4_ = uVar76;
                auVar69._0_4_ = uVar76;
                auVar69._8_4_ = uVar76;
                auVar69._12_4_ = uVar76;
                in_XMM9 = blendvps(in_XMM9,auVar69,auVar19);
                uVar9 = movmskps((int)plVar10,auVar261);
              } while (uVar9 != 0);
            }
            fVar100 = 1.0 - fVar259;
            fVar101 = 1.0 - fVar275;
            fVar112 = 1.0 - fVar277;
            fVar77 = 1.0 - fVar279;
            fVar115 = (float)local_1c8._0_4_ * fVar100 + (float)local_138._0_4_ * fVar259;
            fVar116 = (float)local_1c8._4_4_ * fVar101 + (float)local_138._4_4_ * fVar275;
            fVar118 = (float)uStack_1c0 * fVar112 + fStack_130 * fVar277;
            fVar119 = uStack_1c0._4_4_ * fVar77 + fStack_12c * fVar279;
            fVar195 = (float)local_1b8._0_4_ * fVar100 + (float)local_128._0_4_ * fVar259;
            fVar196 = (float)local_1b8._4_4_ * fVar101 + (float)local_128._4_4_ * fVar275;
            fVar209 = fStack_1b0 * fVar112 + fStack_120 * fVar277;
            fVar210 = fStack_1ac * fVar77 + fStack_11c * fVar279;
            fVar233 = (float)local_1e8._0_4_ * fVar100 + (float)local_118._0_4_ * fVar259;
            fVar234 = (float)local_1e8._4_4_ * fVar101 + (float)local_118._4_4_ * fVar275;
            fVar235 = (float)uStack_1e0 * fVar112 + fStack_110 * fVar277;
            fVar236 = uStack_1e0._4_4_ * fVar77 + fStack_10c * fVar279;
            fVar237 = (float)local_198._0_4_ * fVar100 + (float)local_148._0_4_ * fVar259;
            fVar238 = (float)local_198._4_4_ * fVar101 + (float)local_148._4_4_ * fVar275;
            fVar245 = fStack_190 * fVar112 + fStack_140 * fVar277;
            fVar247 = fStack_18c * fVar77 + fStack_13c * fVar279;
            fVar138 = (float)local_228._0_4_ * fVar100 + (float)local_188._0_4_ * fVar259;
            fVar139 = (float)local_228._4_4_ * fVar101 + (float)local_188._4_4_ * fVar275;
            fVar141 = (float)uStack_220 * fVar112 + fStack_180 * fVar277;
            fVar180 = uStack_220._4_4_ * fVar77 + fStack_17c * fVar279;
            fVar133 = (float)local_1a8._0_4_ * fVar100 + (float)local_178._0_4_ * fVar259;
            fVar134 = (float)local_1a8._4_4_ * fVar101 + (float)local_178._4_4_ * fVar275;
            fVar135 = fStack_1a0 * fVar112 + fStack_170 * fVar277;
            fVar136 = fStack_19c * fVar77 + fStack_16c * fVar279;
            fVar181 = in_XMM5._0_4_ * fVar100 + (float)local_b8._0_4_ * fVar259;
            fVar183 = in_XMM5._4_4_ * fVar101 + (float)local_b8._4_4_ * fVar275;
            fVar191 = in_XMM5._8_4_ * fVar112 + fStack_b0 * fVar277;
            fVar193 = in_XMM5._12_4_ * fVar77 + fStack_ac * fVar279;
            fVar293 = in_XMM6._0_4_ * fVar100 + (float)local_1f8._0_4_ * fVar259;
            fVar294 = in_XMM6._4_4_ * fVar101 + (float)local_1f8._4_4_ * fVar275;
            fVar296 = in_XMM6._8_4_ * fVar112 + fStack_1f0 * fVar277;
            fVar307 = in_XMM6._12_4_ * fVar77 + fStack_1ec * fVar279;
            fVar248 = auVar122._0_4_ * fVar100 + (float)local_218._0_4_ * fVar259;
            fVar276 = auVar122._4_4_ * fVar101 + (float)local_218._4_4_ * fVar275;
            fVar280 = auVar122._8_4_ * fVar112 + fStack_210 * fVar277;
            fVar292 = auVar122._12_4_ * fVar77 + fStack_20c * fVar279;
            fVar211 = auVar104._0_4_ * fVar100 + (float)local_208._0_4_ * fVar259;
            fVar222 = auVar104._4_4_ * fVar101 + (float)local_208._4_4_ * fVar275;
            fVar223 = auVar104._8_4_ * fVar112 + fStack_200 * fVar277;
            fVar232 = auVar104._12_4_ * fVar77 + fStack_1fc * fVar279;
            fVar194 = (float)local_248._0_4_ * fVar100 + (float)local_258._0_4_ * fVar259;
            fVar113 = (float)local_248._4_4_ * fVar101 + (float)local_258._4_4_ * fVar275;
            fVar117 = (float)uStack_240 * fVar112 + fStack_250 * fVar277;
            fVar114 = uStack_240._4_4_ * fVar77 + fStack_24c * fVar279;
            fVar184 = fVar100 * (float)local_1d8._0_4_ + in_XMM9._0_4_ * fVar259;
            fVar246 = fVar101 * (float)local_1d8._4_4_ + in_XMM9._4_4_ * fVar275;
            fVar182 = fVar112 * fStack_1d0 + in_XMM9._8_4_ * fVar277;
            fVar192 = fVar77 * fStack_1cc + in_XMM9._12_4_ * fVar279;
            fVar259 = fVar138 * fVar248 - fVar133 * fVar293;
            fVar275 = fVar139 * fVar276 - fVar134 * fVar294;
            auVar286._4_4_ = fVar275;
            auVar286._0_4_ = fVar259;
            fVar277 = fVar141 * fVar280 - fVar135 * fVar296;
            fVar279 = fVar180 * fVar292 - fVar136 * fVar307;
            auVar215._0_4_ = fVar133 * fVar181 - fVar237 * fVar248;
            auVar215._4_4_ = fVar134 * fVar183 - fVar238 * fVar276;
            auVar215._8_4_ = fVar135 * fVar191 - fVar245 * fVar280;
            auVar215._12_4_ = fVar136 * fVar193 - fVar247 * fVar292;
            local_278._0_4_ = fVar237 * fVar293 - fVar138 * fVar181;
            local_278._4_4_ = fVar238 * fVar294 - fVar139 * fVar183;
            fStack_270 = fVar245 * fVar296 - fVar141 * fVar191;
            fStack_26c = fVar247 * fVar307 - fVar180 * fVar193;
            auVar225._0_4_ = fVar233 * fVar293 - fVar195 * fVar248;
            auVar225._4_4_ = fVar234 * fVar294 - fVar196 * fVar276;
            auVar225._8_4_ = fVar235 * fVar296 - fVar209 * fVar280;
            auVar225._12_4_ = fVar236 * fVar307 - fVar210 * fVar292;
            auVar199._0_4_ = fVar248 * fVar115 - fVar233 * fVar181;
            auVar199._4_4_ = fVar276 * fVar116 - fVar234 * fVar183;
            auVar199._8_4_ = fVar280 * fVar118 - fVar235 * fVar191;
            auVar199._12_4_ = fVar292 * fVar119 - fVar236 * fVar193;
            auVar268._0_4_ = fVar181 * fVar195 - fVar293 * fVar115;
            auVar268._4_4_ = fVar183 * fVar196 - fVar294 * fVar116;
            auVar268._8_4_ = fVar191 * fVar209 - fVar296 * fVar118;
            auVar268._12_4_ = fVar193 * fVar210 - fVar307 * fVar119;
            auVar302._0_4_ = fVar195 * fVar133 - fVar233 * fVar138;
            auVar302._4_4_ = fVar196 * fVar134 - fVar234 * fVar139;
            auVar302._8_4_ = fVar209 * fVar135 - fVar235 * fVar141;
            auVar302._12_4_ = fVar210 * fVar136 - fVar236 * fVar180;
            auVar318._0_4_ = fVar233 * fVar237 - fVar133 * fVar115;
            auVar318._4_4_ = fVar234 * fVar238 - fVar134 * fVar116;
            auVar318._8_4_ = fVar235 * fVar245 - fVar135 * fVar118;
            auVar318._12_4_ = fVar236 * fVar247 - fVar136 * fVar119;
            auVar286._8_4_ = fVar277;
            auVar286._12_4_ = fVar279;
            auVar125._0_4_ = fVar138 * fVar115 - fVar237 * fVar195;
            auVar125._4_4_ = fVar139 * fVar116 - fVar238 * fVar196;
            auVar125._8_4_ = fVar141 * fVar118 - fVar245 * fVar209;
            auVar125._12_4_ = fVar180 * fVar119 - fVar247 * fVar210;
            auVar81._0_4_ =
                 fVar115 * fVar259 + fVar195 * auVar215._0_4_ + fVar233 * (float)local_278._0_4_;
            auVar81._4_4_ =
                 fVar116 * fVar275 + fVar196 * auVar215._4_4_ + fVar234 * (float)local_278._4_4_;
            auVar81._8_4_ = fVar118 * fVar277 + fVar209 * auVar215._8_4_ + fVar235 * fStack_270;
            auVar81._12_4_ = fVar119 * fVar279 + fVar210 * auVar215._12_4_ + fVar236 * fStack_26c;
            auVar282 = divps(auVar286,auVar81);
            auVar254 = divps(auVar225,auVar81);
            auVar299 = divps(auVar302,auVar81);
            auVar214 = divps(auVar215,auVar81);
            _local_268 = divps(auVar199,auVar81);
            auVar316 = divps(auVar318,auVar81);
            auVar261 = divps(_local_278,auVar81);
            _local_278 = divps(auVar268,auVar81);
            auVar122 = divps(auVar125,auVar81);
            fVar259 = fVar211 * auVar282._0_4_ + fVar194 * auVar214._0_4_ + fVar184 * auVar261._0_4_
            ;
            fVar275 = fVar222 * auVar282._4_4_ + fVar113 * auVar214._4_4_ + fVar246 * auVar261._4_4_
            ;
            fVar277 = fVar223 * auVar282._8_4_ + fVar117 * auVar214._8_4_ + fVar182 * auVar261._8_4_
            ;
            fVar279 = fVar232 * auVar282._12_4_ +
                      fVar114 * auVar214._12_4_ + fVar192 * auVar261._12_4_;
            fVar100 = fVar211 * auVar254._0_4_ +
                      fVar194 * local_268._0_4_ + fVar184 * local_278._0_4_;
            fVar101 = fVar222 * auVar254._4_4_ +
                      fVar113 * local_268._4_4_ + fVar246 * local_278._4_4_;
            fVar112 = fVar223 * auVar254._8_4_ +
                      fVar117 * local_268._8_4_ + fVar182 * local_278._8_4_;
            fVar77 = fVar232 * auVar254._12_4_ +
                     fVar114 * local_268._12_4_ + fVar192 * local_278._12_4_;
            fVar184 = fVar211 * auVar299._0_4_ + fVar194 * auVar316._0_4_ + fVar184 * auVar122._0_4_
            ;
            fVar246 = fVar222 * auVar299._4_4_ + fVar113 * auVar316._4_4_ + fVar246 * auVar122._4_4_
            ;
            fVar182 = fVar223 * auVar299._8_4_ + fVar117 * auVar316._8_4_ + fVar182 * auVar122._8_4_
            ;
            fVar192 = fVar232 * auVar299._12_4_ +
                      fVar114 * auVar316._12_4_ + fVar192 * auVar122._12_4_;
          }
        }
        pRVar1 = ray + 0x10;
        fVar194 = *(float *)pRVar1;
        fVar113 = *(float *)(ray + 0x14);
        fVar117 = *(float *)(ray + 0x18);
        auVar120 = *(undefined1 (*) [12])pRVar1;
        fVar114 = *(float *)(ray + 0x1c);
        auVar264 = *(undefined1 (*) [16])pRVar1;
        pRVar1 = ray + 0x20;
        fVar115 = *(float *)pRVar1;
        fVar116 = *(float *)(ray + 0x24);
        fVar118 = *(float *)(ray + 0x28);
        auVar249 = *(undefined1 (*) [12])pRVar1;
        fVar119 = *(float *)(ray + 0x2c);
        auVar265 = *(undefined1 (*) [16])pRVar1;
        fVar133 = *(float *)ray;
        fVar134 = *(float *)(ray + 4);
        fVar135 = *(float *)(ray + 8);
        auVar46 = *(undefined1 (*) [12])ray;
        fVar136 = *(float *)(ray + 0xc);
        auVar18 = *(undefined1 (*) [16])ray;
        pRVar1 = ray + 0x40;
        fVar138 = *(float *)pRVar1;
        fVar139 = *(float *)(ray + 0x44);
        fVar141 = *(float *)(ray + 0x48);
        auVar6 = *(undefined1 (*) [12])pRVar1;
        fVar180 = *(float *)(ray + 0x4c);
        auVar91 = *(undefined1 (*) [16])pRVar1;
        pRVar1 = ray + 0x50;
        fVar181 = *(float *)pRVar1;
        fVar183 = *(float *)(ray + 0x54);
        fVar191 = *(float *)(ray + 0x58);
        auVar251 = *(undefined1 (*) [12])pRVar1;
        fVar193 = *(float *)(ray + 0x5c);
        auVar29 = *(undefined1 (*) [16])pRVar1;
        pRVar1 = ray + 0x60;
        fVar195 = *(float *)pRVar1;
        fVar196 = *(float *)(ray + 100);
        fVar209 = *(float *)(ray + 0x68);
        auVar250 = *(undefined1 (*) [12])pRVar1;
        fVar210 = *(float *)(ray + 0x6c);
        auVar272 = *(undefined1 (*) [16])pRVar1;
        *(float *)ray =
             auVar282._0_4_ * fVar133 +
             auVar214._0_4_ * fVar194 + auVar261._0_4_ * fVar115 + -fVar259;
        *(float *)(ray + 4) =
             auVar282._4_4_ * fVar134 +
             auVar214._4_4_ * fVar113 + auVar261._4_4_ * fVar116 + -fVar275;
        *(float *)(ray + 8) =
             auVar282._8_4_ * fVar135 +
             auVar214._8_4_ * fVar117 + auVar261._8_4_ * fVar118 + -fVar277;
        *(float *)(ray + 0xc) =
             auVar282._12_4_ * fVar136 +
             auVar214._12_4_ * fVar114 + auVar261._12_4_ * fVar119 + -fVar279;
        *(float *)(ray + 0x10) =
             auVar254._0_4_ * fVar133 +
             (float)local_268._0_4_ * fVar194 + (float)local_278._0_4_ * fVar115 + -fVar100;
        *(float *)(ray + 0x14) =
             auVar254._4_4_ * fVar134 +
             (float)local_268._4_4_ * fVar113 + (float)local_278._4_4_ * fVar116 + -fVar101;
        *(float *)(ray + 0x18) =
             auVar254._8_4_ * fVar135 + fStack_260 * fVar117 + fStack_270 * fVar118 + -fVar112;
        *(float *)(ray + 0x1c) =
             auVar254._12_4_ * fVar136 + fStack_25c * fVar114 + fStack_26c * fVar119 + -fVar77;
        *(float *)(ray + 0x20) =
             auVar299._0_4_ * fVar133 +
             auVar316._0_4_ * fVar194 + auVar122._0_4_ * fVar115 + -fVar184;
        *(float *)(ray + 0x24) =
             auVar299._4_4_ * fVar134 +
             auVar316._4_4_ * fVar113 + auVar122._4_4_ * fVar116 + -fVar246;
        *(float *)(ray + 0x28) =
             auVar299._8_4_ * fVar135 +
             auVar316._8_4_ * fVar117 + auVar122._8_4_ * fVar118 + -fVar182;
        *(float *)(ray + 0x2c) =
             auVar299._12_4_ * fVar136 +
             auVar316._12_4_ * fVar114 + auVar122._12_4_ * fVar119 + -fVar192;
        *(float *)(ray + 0x40) =
             auVar282._0_4_ * fVar138 + auVar214._0_4_ * fVar181 + auVar261._0_4_ * fVar195;
        *(float *)(ray + 0x44) =
             auVar282._4_4_ * fVar139 + auVar214._4_4_ * fVar183 + auVar261._4_4_ * fVar196;
        *(float *)(ray + 0x48) =
             auVar282._8_4_ * fVar141 + auVar214._8_4_ * fVar191 + auVar261._8_4_ * fVar209;
        *(float *)(ray + 0x4c) =
             auVar282._12_4_ * fVar180 + auVar214._12_4_ * fVar193 + auVar261._12_4_ * fVar210;
        *(float *)(ray + 0x50) =
             auVar254._0_4_ * fVar138 +
             (float)local_268._0_4_ * fVar181 + (float)local_278._0_4_ * fVar195;
        *(float *)(ray + 0x54) =
             auVar254._4_4_ * fVar139 +
             (float)local_268._4_4_ * fVar183 + (float)local_278._4_4_ * fVar196;
        *(float *)(ray + 0x58) =
             auVar254._8_4_ * fVar141 + fStack_260 * fVar191 + fStack_270 * fVar209;
        *(float *)(ray + 0x5c) =
             auVar254._12_4_ * fVar180 + fStack_25c * fVar193 + fStack_26c * fVar210;
        *(float *)(ray + 0x60) =
             auVar299._0_4_ * fVar138 + auVar316._0_4_ * fVar181 + auVar122._0_4_ * fVar195;
        *(float *)(ray + 100) =
             auVar299._4_4_ * fVar139 + auVar316._4_4_ * fVar183 + auVar122._4_4_ * fVar196;
        *(float *)(ray + 0x68) =
             auVar299._8_4_ * fVar141 + auVar316._8_4_ * fVar191 + auVar122._8_4_ * fVar209;
        *(float *)(ray + 0x6c) =
             auVar299._12_4_ * fVar180 + auVar316._12_4_ * fVar193 + auVar122._12_4_ * fVar210;
        local_48 = context->args;
        local_28 = local_38._0_8_;
        uStack_20 = local_38._8_8_;
        stack0xffffffffffffffb0 = pRVar3;
        local_58._0_8_ = p_Var7;
        local_38 = auVar121;
        (**(code **)(p_Var7 + 0xa0))(&local_28,p_Var7 + 0x58,ray);
        local_238 = auVar46._0_8_;
        uStack_230 = auVar18._8_8_;
        *(undefined1 (*) [8])ray = local_238;
        *(undefined8 *)(ray + 8) = uStack_230;
        local_228 = auVar120._0_8_;
        uStack_220 = auVar264._8_8_;
        *(undefined1 (*) [8])(ray + 0x10) = local_228;
        *(undefined8 *)(ray + 0x18) = uStack_220;
        local_288 = auVar249._0_8_;
        uStack_280 = auVar265._8_8_;
        *(undefined1 (*) [8])(ray + 0x20) = local_288;
        *(undefined8 *)(ray + 0x28) = uStack_280;
        local_1e8 = auVar6._0_8_;
        uStack_1e0 = auVar91._8_8_;
        *(undefined1 (*) [8])(ray + 0x40) = local_1e8;
        *(undefined8 *)(ray + 0x48) = uStack_1e0;
        local_1c8 = auVar251._0_8_;
        uStack_1c0 = auVar29._8_8_;
        *(undefined1 (*) [8])(ray + 0x50) = local_1c8;
        *(undefined8 *)(ray + 0x58) = uStack_1c0;
        local_248 = auVar250._0_8_;
        uStack_240 = auVar272._8_8_;
        *(undefined1 (*) [8])(ray + 0x60) = local_248;
        *(undefined8 *)(ray + 0x68) = uStack_240;
        fVar259 = *(float *)(ray + 0x84);
        fVar275 = *(float *)(ray + 0x88);
        fVar277 = *(float *)(ray + 0x8c);
        *(uint *)this = -(uint)(*(float *)(ray + 0x80) < 0.0);
        *(uint *)(this + 4) = -(uint)(fVar259 < 0.0);
        *(uint *)(this + 8) = -(uint)(fVar275 < 0.0);
        *(uint *)(this + 0xc) = -(uint)(fVar277 < 0.0);
        pRVar3->instID[0] = 0xffffffff;
        pRVar3->instPrimID[0] = 0xffffffff;
        pGVar8 = extraout_RDX;
      }
      goto LAB_002ccd45;
    }
  }
  *(undefined8 *)this = mm_lookupmask_ps._0_8_;
  *(undefined8 *)(this + 8) = uVar2;
LAB_002ccd45:
  vVar327.field_0._8_8_ = pGVar8;
  vVar327.field_0._0_8_ = this;
  return (vbool<4>)vVar327.field_0;
}

Assistant:

vbool<K> InstanceArrayIntersectorKMB<K>::occluded(const vbool<K>& valid_i, const Precalculations& pre, RayK<K>& ray, RayQueryContext* context, const Primitive& prim)
    {
      vbool<K> valid = valid_i;
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return false;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      vbool<K> occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local<K>(prim.primID_, valid, ray.time());
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);
      }
      return occluded;
    }